

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  char *pcVar1;
  char cVar2;
  uint8_t uVar3;
  short sVar4;
  ushort uVar5;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar6;
  uint64_t uVar7;
  SnapEntry *pSVar8;
  GCtrace *T_00;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  MCode *pMVar11;
  undefined2 uVar12;
  ushort uVar13;
  CTInfo CVar14;
  Reg RVar15;
  TRef TVar16;
  MCode *p_1;
  GCtrace *pGVar17;
  IRIns *pIVar18;
  byte *pbVar19;
  MCode MVar20;
  Reg RVar21;
  uint uVar22;
  MCode *p;
  long lVar23;
  ushort *puVar24;
  void *addr;
  code *pcVar25;
  BCReg BVar26;
  x86Shift xs;
  IRCallID id_00;
  int iVar27;
  IRRef IVar28;
  ulong uVar29;
  IRIns u64;
  IRIns IVar30;
  byte *pbVar31;
  x86Op xVar32;
  byte *pbVar33;
  uint *u64_00;
  IRIns *pIVar34;
  CCallInfo *pCVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  IRIns IVar39;
  byte bVar40;
  IRRef1 IVar41;
  uint uVar42;
  BCReg BVar43;
  MSize MVar44;
  code *target;
  uint16_t *puVar45;
  int32_t iVar46;
  long lVar47;
  MCode MVar48;
  MCode MVar49;
  byte bVar50;
  uint uVar51;
  undefined4 uVar52;
  SnapEntry sn;
  Reg rb;
  RegSet RVar53;
  byte bVar54;
  uint uVar55;
  bool bVar56;
  bool bVar57;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar59 [16];
  CTSize sz;
  IRRef args [64];
  ushort auStack_10372 [32545];
  code *pcStack_530;
  IRIns local_528;
  uint local_51c;
  ulong local_518;
  IRIns *local_510;
  undefined1 local_508 [172];
  RegSet RStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint32_t local_450;
  int local_44c;
  uint local_448;
  uint local_444;
  IRRef local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  int local_424;
  IRRef local_410;
  IRRef local_40c;
  IRRef local_408;
  undefined8 local_404;
  GCtrace *local_3f8;
  GCtrace *local_3f0;
  MCode *local_3e8;
  byte *local_3e0;
  byte *local_3d8;
  byte *local_3d0;
  undefined1 local_3c8 [16];
  byte *local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  ushort local_370 [252];
  IRIns *local_178;
  uint local_16c;
  IRIns local_168;
  uint32_t local_160;
  ulong local_158;
  jit_State *local_150;
  GCtrace *local_148;
  global_State *local_140;
  TValue local_138;
  uint32_t local_130;
  undefined4 local_12c;
  
  uVar29 = (ulong)(T->nins - 1);
  cVar2 = *(char *)((long)T->ir + uVar29 * 8 + 5);
  if ((cVar2 == '\x14') || (cVar2 == '\f')) {
    while ((cVar2 = *(char *)((long)T->ir + uVar29 * 8 + -3), cVar2 == '\x14' || (cVar2 == '\f'))) {
      uVar29 = uVar29 - 1;
    }
    T->nins = (IRRef)uVar29;
  }
  uVar38 = (J->cur).nins;
  if (J->irtoplim <= uVar38) {
    pcStack_530 = (code *)0x141fc4;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar38 + 1;
  (J->cur).ir[uVar38] = (IRIns)0xc0000000000;
  pcStack_530 = (code *)0x13cadb;
  local_508._152_8_ = J;
  local_438 = uVar38;
  local_3f8 = T;
  pGVar17 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar17;
  local_450 = J->flags;
  local_408 = J->loopref;
  local_3b8 = (byte *)0x0;
  local_44c = 0;
  if ((ulong)J->parent == 0) {
    local_3f0 = (GCtrace *)0x0;
  }
  else {
    local_3f0 = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  pcStack_530 = (code *)0x13cb44;
  local_508._128_8_ = lj_mcode_reserve(J,&local_3e8);
  local_3d8 = (byte *)local_508._128_8_;
  local_3e0 = (byte *)local_508._128_8_;
  local_508._136_8_ = local_3e8 + 0x40;
  uVar13 = local_3f8->nsnap;
  if (0x1ff < uVar13) {
    pcStack_530 = (code *)0x142023;
    lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_SNAPOV);
  }
  if (uVar13 != 0) {
    MVar20 = '\x01';
    uVar29 = 0;
    do {
      pMVar11 = local_3e8;
      if (((MCode **)(local_508._152_8_ + 0x6a0))[uVar29] == (MCode *)0x0) {
        if ((ulong)local_508._128_8_ <= local_3e8 + 0x8d) goto LAB_00141ded;
        *local_3e8 = 'j';
        local_3e8[1] = (MCode)((int)uVar29 << 5);
        MVar48 = 'z';
        lVar23 = 0;
        MVar49 = MVar20;
        do {
          lVar47 = lVar23;
          local_3e8[lVar47 + 2] = 0xeb;
          local_3e8[lVar47 + 3] = MVar48;
          local_3e8[lVar47 + 4] = 'j';
          local_3e8[lVar47 + 5] = MVar49;
          MVar49 = MVar49 + '\x01';
          MVar48 = MVar48 + 0xfc;
          lVar23 = lVar47 + 4;
        } while ((int)(lVar47 + 4) != 0x7c);
        local_3e8[lVar47 + 6] = 'j';
        local_3e8[lVar47 + 7] = (MCode)(uVar29 >> 3);
        local_3e8[lVar47 + 8] = 0xe9;
        *(int *)(local_3e8 + lVar47 + 9) = 0x10d4b6 - (int)local_3e8;
        *(MCode **)(local_508._152_8_ + 0xbf8) = local_3e8 + lVar47 + 0xd;
        local_3e8 = local_3e8 + lVar47 + 0xd;
        local_508._136_8_ = pMVar11 + lVar47 + 0x4d;
        ((MCode **)(local_508._152_8_ + 0x6a0))[uVar29] = pMVar11;
      }
      uVar29 = uVar29 + 1;
      MVar20 = MVar20 + ' ';
    } while (uVar29 != uVar13 + 0x1f >> 5);
  }
  local_508._164_2_ = local_508._164_2_ & 0xff00;
  local_140 = (global_State *)&J[-1].penalty[0x24].val;
  pGVar17 = J->curfinal;
  auVar59 = pmovsxbw(in_XMM1,0xff00ff00ff00ff00);
  local_148 = T;
  local_150 = J;
LAB_0013ccb3:
  local_508._144_8_ = pGVar17->ir;
  (J->cur).nins = local_438;
  local_440 = local_438;
  pbVar33 = local_3e0;
  if (local_3b8 != (byte *)0x0) {
    if (((ulong)local_3b8 & 0xf) != 0) {
      pbVar33 = local_3e0 + (int)-((uint)local_3b8 & 0xf);
      pcStack_530 = (code *)0x13cd02;
      memset(pbVar33,0x90,(ulong)((uint)local_3b8 & 0xf));
      auVar59 = pmovsxbw(auVar59,0xff00ff00ff00ff00);
    }
    local_3e0 = pbVar33;
    pbVar33 = pbVar33 + (ulong)(local_44c == 0) * 3;
  }
  local_3c8._0_8_ = pbVar33 + -5;
  local_508._128_8_ = local_3c8._0_8_;
  if (local_408 == 0) {
    local_3c8._0_8_ = (byte *)0x0;
    local_508._128_8_ = pbVar33 + -0xc;
  }
  local_3d0 = (byte *)0x0;
  local_3c8._8_8_ = 0;
  local_404._0_4_ = 0;
  local_404._4_4_ = 0;
  local_40c = local_408;
  local_410 = local_408;
  if ((local_450 >> 0x19 & 1) == 0) {
    local_410 = 0xffffffff;
  }
  uVar3 = local_3f8->sinktags;
  local_440 = local_3f8->nins;
  uVar29 = (ulong)local_440;
  stack0xfffffffffffffba0 = ZEXT416(0xffffbfef);
  local_380 = (undefined1  [16])0x0;
  local_390 = (undefined1  [16])0x0;
  local_3a0 = (undefined1  [16])0x0;
  local_3b0 = (undefined1  [16])0x0;
  lVar23 = 0;
  do {
    *(undefined1 (*) [16])(local_508 + lVar23 * 4) = auVar59;
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0x20);
  if ((ulong)local_3f8->nk < 0x8000) {
    lVar23 = (ulong)local_3f8->nk << 3;
    do {
      *(undefined2 *)(local_508._144_8_ + lVar23 + 6) = 0xff;
      if (((0x605fd9U >> (*(uint *)(local_508._144_8_ + lVar23 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)(local_508._144_8_ + lVar23 + 5) != '\x1b')) {
        *(undefined4 *)(local_508._144_8_ + lVar23) = 0;
        lVar23 = lVar23 + 8;
      }
      bVar57 = lVar23 < 0x3fff8;
      lVar23 = lVar23 + 8;
    } while (bVar57);
  }
  *(undefined2 *)(local_508._144_8_ + 0x40006) = 0x82;
  local_430 = local_440;
  local_434 = local_440;
  local_42c = (uint)local_3f8->nsnap;
  local_424 = 0;
  local_43c = 0x8000;
  local_438 = local_440;
  pIVar34 = (IRIns *)(local_508._144_8_ + 0x40008);
  if (local_3f0 != (GCtrace *)0x0) {
    pcStack_530 = (code *)0x13ceb4;
    pIVar18 = lj_snap_regspmap((jit_State *)local_508._152_8_,local_3f0,
                               *(ExitNo *)(local_508._152_8_ + 0xbcc),pIVar34);
    if (2000 < (long)pIVar18 - (long)pIVar34) {
LAB_00141fc9:
      pcStack_530 = (code *)0x141fdb;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYICOAL);
    }
    local_43c = (uint)((ulong)((long)pIVar18 + (-8 - local_508._144_8_)) >> 3);
    if (pIVar34 < pIVar18) {
      puVar24 = local_370;
      do {
        uVar13 = (pIVar34->field_0).prev;
        *puVar24 = uVar13;
        puVar24 = puVar24 + 1;
        IVar41 = uVar13 | 0x80;
        if (0xff < uVar13) {
          IVar41 = 0xff;
        }
        (pIVar34->field_0).prev = IVar41;
        pIVar34 = pIVar34 + 1;
      } while (pIVar34 < pIVar18);
    }
  }
  local_448 = 2;
  pIVar18 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
  if (pIVar34 < pIVar18) {
    bVar57 = false;
LAB_0013cf4b:
    if (uVar3 != '\0') {
      if ((pIVar34->field_1).r != 0xfe) {
        if ((pIVar34->field_1).r != 0xfd) goto LAB_0013cf71;
        (pIVar34->field_1).r = 0xfe;
      }
      goto LAB_0013d20f;
    }
LAB_0013cf71:
    uVar29 = local_508._168_8_;
    switch((pIVar34->field_1).o) {
    case '\x10':
      uVar38 = *(byte *)((long)pIVar34 + -3) - 0x5f;
      if ((4 < uVar38) || (uVar38 == 1)) goto switchD_0013cf89_caseD_42;
      *(undefined2 *)((long)pIVar34 + -2) = 0x80;
      (pIVar34->field_0).prev = 0x82;
      break;
    case '\x11':
switchD_0013cf89_caseD_11:
      bVar57 = true;
      goto switchD_0013cf89_caseD_42;
    default:
      uVar13 = (pIVar34->field_0).op2;
LAB_0013d1c8:
      if ((((short)uVar13 < 0) || (-1 < (short)(pIVar34->field_0).op1)) ||
         (IVar41 = *(IRRef1 *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6),
         0xfc < (byte)IVar41)) goto switchD_0013cf89_caseD_42;
      (pIVar34->field_0).prev = IVar41;
      break;
    case '$':
    case '%':
    case '&':
      if ((local_450 & 0x40) == 0) goto switchD_0013cf89_caseD_27;
      goto switchD_0013cf89_caseD_42;
    case '\'':
    case '(':
switchD_0013cf89_caseD_27:
      uVar13 = (pIVar34->field_0).op2;
      if (((short)uVar13 < 0) && (0xfc < *(byte *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6))) {
        *(undefined1 *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6) = 0x81;
        if (bVar57) {
          stack0xfffffffffffffba0 = local_508._168_5_ | 0x200000000;
          bVar57 = true;
        }
        else {
          bVar57 = false;
        }
      }
      goto switchD_0013cf89_caseD_42;
    case ',':
    case '-':
switchD_0013cf89_caseD_2c:
      if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) goto switchD_0013cf89_caseD_42;
      (pIVar34->field_0).prev = 0x80;
      if (!bVar57) goto LAB_0013d1a5;
      stack0xfffffffffffffba0 = uVar29 | 0xfc700000000;
LAB_0013cfa6:
      bVar57 = true;
      break;
    case '.':
      if (((pIVar34->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013cf89_caseD_2c;
LAB_0013d1aa:
      if (bVar57) {
        stack0xfffffffffffffba0 = uVar29 | 0xffff0fc700000000;
      }
      (pIVar34->field_0).prev = 0x90;
      break;
    case '4':
      if (2 < (pIVar34->field_0).op2) goto LAB_0013d1aa;
      if ((local_450 & 0x20) == 0) {
        (pIVar34->field_0).prev = 0x90;
        if (!bVar57) goto LAB_0013d1a5;
        stack0xfffffffffffffba0 = uVar29 | 0xf000100000000;
        goto LAB_0013cfa6;
      }
      goto switchD_0013cf89_caseD_42;
    case ';':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'V':
    case 'W':
    case ']':
      (pIVar34->field_0).prev = 0x80;
      if (bVar57) {
        RStack_45c = 0xffff0fc7;
        goto LAB_0013cfa6;
      }
LAB_0013d1a5:
      bVar57 = false;
      break;
    case 'B':
    case 'C':
    case 'D':
    case 'F':
    case 'H':
    case '\\':
      goto switchD_0013cf89_caseD_42;
    case 'Y':
    case '^':
      if (bVar57) {
        RStack_45c = 0xffff0fc7;
        goto switchD_0013cf89_caseD_11;
      }
      bVar57 = false;
      goto switchD_0013cf89_caseD_42;
    case '[':
      if ((1 < (byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd)) &&
         (uVar13 = (pIVar34->field_0).op2, 1 < (ushort)((uVar13 & 0x1f) - 0xd))) goto LAB_0013d1c8;
switchD_0013cf89_caseD_42:
      (pIVar34->field_0).prev = 0xff;
      break;
    case '_':
    case '`':
    case 'b':
      goto switchD_0013cf89_caseD_5f;
    case 'a':
      if (((pIVar34->field_0).op2 == 0x25) && ((int)local_448 < 4)) {
        local_448 = 4;
      }
      goto switchD_0013cf89_caseD_5f;
    case 'c':
      pcStack_530 = (code *)0x13d13c;
      local_130 = asm_callx_flags((ASMState *)local_508,pIVar34);
      pcStack_530 = (code *)0x13d156;
      RVar21 = asm_setup_call_slots((ASMState *)local_508,pIVar34,(CCallInfo *)&local_138.gcr);
      (pIVar34->field_0).prev = (IRRef1)RVar21;
      if (bVar57) {
        stack0xfffffffffffffba0 = local_508._168_8_ | 0xffff0fc700000000;
      }
    }
    goto LAB_0013d20f;
  }
  goto LAB_0013d227;
switchD_0013cf89_caseD_5f:
  uVar13 = (pIVar34->field_0).op2;
  pcStack_530 = (code *)0x13d05f;
  RVar21 = asm_setup_call_slots((ASMState *)local_508,pIVar34,lj_ir_callinfo + uVar13);
  (pIVar34->field_0).prev = (IRRef1)RVar21;
  if (bVar57) {
    RStack_45c = RStack_45c |
                 (uint)((*(byte *)((long)&lj_ir_callinfo[uVar13].flags + 1) & 4) >> 2) * 0x10000 -
                 0xf039;
  }
  else {
    bVar57 = false;
  }
LAB_0013d20f:
  uVar38 = local_448;
  pIVar34 = pIVar34 + 1;
  if (pIVar18 <= pIVar34) goto code_r0x0013d21c;
  goto LAB_0013cf4b;
code_r0x0013d21c:
  if ((local_448 & 1) == 0) {
LAB_0013d227:
    uVar38 = 0;
  }
  else {
    local_448 = local_448 + 1;
  }
  local_444 = uVar38;
  if (local_408 == 0) {
    uVar36 = (ulong)(local_3f8->nsnap - 1);
    pSVar6 = local_3f8->snap;
    uVar29 = (ulong)pSVar6[uVar36].nent;
    if (uVar29 == 0) {
      uVar55 = 0;
      uVar38 = 0;
    }
    else {
      do {
        if ((local_3f8->snapmap[(ulong)pSVar6[uVar36].mapofs + (uVar29 - 1)] >> 0x10 & 1) != 0) {
          uVar38 = (local_3f8->snapmap[(ulong)pSVar6[uVar36].mapofs + (uVar29 - 1)] >> 0x18) - 1;
          uVar55 = (uint)CONCAT71((int7)((ulong)pIVar34 >> 8),1);
          goto LAB_0013d2ab;
        }
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
      uVar55 = 0;
      uVar38 = 0;
    }
LAB_0013d2ab:
    pSVar6 = pSVar6 + uVar36;
    local_404._0_4_ = (uint)pSVar6->topslot;
    if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
    pcStack_530 = (code *)0x13d2e5;
    ra_allocref((ASMState *)local_508,0x8000,4);
    if (local_3f8->link == 0) {
      u64_00 = (uint *)(*(ulong *)(local_3f8->snapmap + ((uint)pSVar6->nent + pSVar6->mapofs)) >> 8)
      ;
      if (((char)*u64_00 == 'W') &&
         (uVar7 = (*(GCRef **)(local_508._152_8_ + 0x180))[*u64_00 >> 0x10].gcptr64,
         0xfffffffb < *(byte *)(uVar7 + 0x50) - 0x4d)) {
        u64_00 = (uint *)(uVar7 + 0x50);
      }
      pcStack_530 = (code *)0x13d37b;
      emit_loadu64((ASMState *)local_508,3,(uint64_t)u64_00);
      iVar37 = ~uVar38 + (uint)pSVar6->nslots;
      uVar51 = *u64_00;
      uVar42 = (uVar51 & 0xff) - 0x3f;
      uVar42 = uVar42 >> 1 | (uint)((uVar42 & 1) != 0) << 0x1f;
      if (uVar42 - 1 < 2) {
        iVar37 = (iVar37 - ((uVar51 >> 0x10 & 0xff) + (uVar51 >> 8 & 0xff))) + -2;
LAB_0013d3c7:
        if (iVar37 == 0) goto LAB_0013d3e2;
LAB_0013d3f3:
        *(int *)(local_508._128_8_ + -4) = iVar37;
        *(byte *)(local_508._128_8_ + -5) = 0xb8;
        local_508._128_8_ = local_508._128_8_ + -5;
      }
      else {
        if (uVar42 == 0) {
          uVar42 = uVar51 >> 8 & 0xff;
LAB_0013d3c5:
          iVar37 = iVar37 - uVar42;
          goto LAB_0013d3c7;
        }
        if (uVar42 == 5) {
          uVar42 = (uVar51 >> 0x10) + (uVar51 >> 8 & 0xff);
          goto LAB_0013d3c5;
        }
        if (0x58 < (uVar51 & 0xff)) goto LAB_0013d3c7;
LAB_0013d3e2:
        if ((*(byte *)local_508._128_8_ != 0xf) && ((*(byte *)local_508._128_8_ & 0xf0) == 0x70)) {
          iVar37 = 0;
          goto LAB_0013d3f3;
        }
        ((byte *)(local_508._128_8_ + -2))[0] = 0x33;
        ((byte *)(local_508._128_8_ + -2))[1] = 0xc0;
        local_508._128_8_ = local_508._128_8_ + -2;
      }
LAB_0013d418:
      if (uVar38 != 0) {
        iVar37 = uVar38 * 8;
        if ((char)(byte)iVar37 == iVar37) {
          *(byte *)(local_508._128_8_ + -1) = (byte)iVar37;
          local_508._128_8_ = local_508._128_8_ + -1;
          uVar52 = 0x830000fe;
        }
        else {
          *(int *)(local_508._128_8_ + -4) = iVar37;
          local_508._128_8_ = local_508._128_8_ + -4;
          uVar52 = 0x810000fe;
        }
        *(byte *)(local_508._128_8_ + -1) = 0xc2;
        *(undefined4 *)(local_508._128_8_ + -5) = uVar52;
        *(byte *)(local_508._128_8_ + -3) = 0x48;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
      }
    }
    else if (uVar38 != 0) {
      pcStack_530 = (code *)0x13d322;
      emit_rma((ASMState *)local_508,XO_MOVto,0x80202,
               ((jit_State *)(local_508._152_8_ + -0xc48))->penalty + 0x3c);
      goto LAB_0013d418;
    }
    if ((ulong)*(IRRef1 *)(local_508._152_8_ + 400) != 0) {
      *(IRIns *)(local_508._144_8_ + ((ulong)*(IRRef1 *)(local_508._152_8_ + 400) + 1) * 8) =
           *(IRIns *)(local_508._152_8_ + 0x78);
      *(undefined1 *)(local_508._144_8_ + (ulong)*(IRRef1 *)(local_508._152_8_ + 400) * 8 + 5) =
           0x18;
    }
    IVar30.gcr.gcptr64._1_7_ = 0;
    IVar30.field_0.op1._0_1_ = pSVar6->nent;
    local_51c = uVar55;
    local_518 = uVar36;
    if (IVar30 != (IRIns)0x0) {
      uVar38 = pSVar6->mapofs;
      pSVar8 = local_3f8->snapmap;
      IVar39 = (IRIns)0x0;
      local_528 = IVar30;
      do {
        uVar55 = pSVar8[(ulong)uVar38 + (long)IVar39];
        if ((uVar55 >> 0x12 & 1) == 0) {
          iVar37 = (uVar55 >> 0x18) * 8 + -0x10;
          uVar51 = (uVar55 >> 0x18) * 8;
          uVar42 = uVar55 & 0xffff;
          pIVar34 = (IRIns *)((ulong)(uVar42 * 8) + local_508._144_8_);
          bVar50 = (byte)iVar37;
          if ((uVar55 >> 0x14 & 1) == 0) {
            if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) {
              RVar21 = (Reg)(char)(pIVar34->field_1).r;
              if ((char)(pIVar34->field_1).r < '\0') {
                pcStack_530 = (code *)0x13d52f;
                RVar21 = ra_allocref((ASMState *)local_508,uVar42,0xffff0000);
              }
              bVar50 = (byte)RVar21 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              xVar32 = XO_MOVSDto;
            }
            else {
              if (uVar42 < 0x8000) {
                pcStack_530 = (code *)0x13d5a8;
                lj_ir_kvalue(*(lua_State **)(local_508._152_8_ + 0x80),&local_138,pIVar34);
                lVar23 = CONCAT26(local_138.u64._6_2_,
                                  CONCAT24(local_138.u64._4_2_,local_138.field_4.i));
                IVar30 = local_528;
                if (lVar23 == -1) {
                  pbVar33 = (byte *)(local_508._128_8_ + -4);
                  pbVar33[0] = 0xff;
                  pbVar33[1] = 0xff;
                  pbVar33[2] = 0xff;
                  pbVar33[3] = 0xff;
                  if (iVar37 == 0) {
                    local_508._128_8_ = local_508._128_8_ + -4;
                    bVar50 = 2;
                  }
                  else if (uVar55 < 0x12000000) {
                    *(byte *)(local_508._128_8_ + -5) = bVar50;
                    local_508._128_8_ = local_508._128_8_ + -5;
                    bVar50 = 0x42;
                  }
                  else {
                    *(int *)(local_508._128_8_ + -8) = iVar37;
                    local_508._128_8_ = local_508._128_8_ + -8;
                    bVar50 = 0x82;
                  }
                  *(byte *)(local_508._128_8_ + -1) = bVar50;
                  *(byte *)(local_508._128_8_ + -3) = 0x48;
                  *(byte *)(local_508._128_8_ + -2) = 199;
                  local_508._128_8_ = local_508._128_8_ + -3;
                  goto LAB_0013d872;
                }
                *(int *)(local_508._128_8_ + -4) = (int)((ulong)lVar23 >> 0x20);
                if (uVar51 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar51 - 0xc);
                  ((byte *)(local_508._128_8_ + -7))[0] = 199;
                  ((byte *)(local_508._128_8_ + -7))[1] = 0x42;
                  *(int32_t *)(local_508._128_8_ + -0xb) = local_138.field_4.i;
                  if (iVar37 != 0) {
                    pbVar33 = (byte *)(local_508._128_8_ + -5);
                    goto LAB_0013d7c3;
                  }
                  pbVar33 = (byte *)(local_508._128_8_ + -0xb);
                  bVar50 = 2;
                }
                else {
                  pbVar33 = (byte *)(local_508._128_8_ + -8);
                  *(uint *)(local_508._128_8_ + -8) = uVar51 - 0xc;
                  ((byte *)(local_508._128_8_ + -10))[0] = 199;
                  ((byte *)(local_508._128_8_ + -10))[1] = 0x82;
                  *(int32_t *)(local_508._128_8_ + -0xe) = local_138.field_4.i;
LAB_0013d7c3:
                  if (uVar55 < 0x12000000) {
                    pbVar33[-7] = bVar50;
                    pbVar33 = pbVar33 + -7;
                    bVar50 = 0x42;
                  }
                  else {
                    *(int *)(pbVar33 + -10) = iVar37;
                    pbVar33 = pbVar33 + -10;
                    bVar50 = 0x82;
                  }
                }
                pbVar33[-1] = bVar50;
                pbVar33[-2] = 199;
                local_508._128_8_ = pbVar33 + -2;
                goto LAB_0013d872;
              }
              RVar21 = (Reg)(char)(pIVar34->field_1).r;
              if ((char)(pIVar34->field_1).r < '\0') {
                pcStack_530 = (code *)0x13d6ba;
                RVar21 = ra_allocref((ASMState *)local_508,uVar42,0xbfeb);
              }
              bVar50 = (byte)RVar21 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              uVar55 = (pIVar34->field_1).t.irt & 0x1f;
              uVar42 = ~uVar55;
              if ((0x605fd9U >> uVar55 & 1) == 0) {
                *(uint *)(local_508._128_8_ + -4) = uVar42 << 0xf | 0x7fff;
                if (uVar51 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar51 - 0xc);
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar50 = 199;
                  bVar54 = 0x42;
                }
                else {
                  *(uint *)(local_508._128_8_ + -8) = uVar51 - 0xc;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar50 = 199;
                  bVar54 = 0x82;
                }
              }
              else {
                *(uint *)(local_508._128_8_ + -4) = uVar42 << 0xf;
                if (uVar51 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar51 - 0xc);
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar50 = 0x81;
                  bVar54 = 0x4a;
                }
                else {
                  *(uint *)(local_508._128_8_ + -8) = uVar51 - 0xc;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar50 = 0x81;
                  bVar54 = 0x8a;
                }
              }
              *(byte *)(local_508._128_8_ + -1) = bVar54;
              *(byte *)(local_508._128_8_ + -2) = bVar50;
              local_508._128_8_ = local_508._128_8_ + -2;
              uVar55._0_2_ = *(IROpT *)((long)pIVar34 + 4);
              uVar55._2_2_ = *(IRRef1 *)((long)pIVar34 + 6);
              RVar21 = -(uint)((0x605fd9U >> (uVar55 & 0x1f) & 1) != 0) & 0x80200 | RVar21;
              xVar32 = XO_MOVto;
            }
LAB_0013d68d:
            pcStack_530 = (code *)0x13d69a;
            emit_rmro((ASMState *)local_508,xVar32,RVar21,2,iVar37);
            IVar30 = local_528;
          }
          else {
            pbVar33 = (byte *)(local_508._128_8_ + -4);
            pbVar33[0] = 0xff;
            pbVar33[1] = 0x7f;
            pbVar33[2] = 0xfe;
            pbVar33[3] = 0xff;
            if (uVar51 < 0x8c) {
              *(byte *)(local_508._128_8_ + -5) = (byte)(uVar51 - 0xc);
              pbVar33 = (byte *)(local_508._128_8_ + -5);
              bVar54 = 0x42;
            }
            else {
              *(uint *)(local_508._128_8_ + -8) = uVar51 - 0xc;
              pbVar33 = (byte *)(local_508._128_8_ + -8);
              bVar54 = 0x82;
            }
            pbVar33[-1] = bVar54;
            local_508._128_8_ = pbVar33 + -2;
            pbVar33[-2] = 199;
            if (0x7fff < uVar42) {
              cVar2 = *(char *)(local_508._144_8_ + (ulong)uVar42 * 8 + 6);
              RVar21 = (Reg)cVar2;
              if (cVar2 < '\0') {
                pcStack_530 = (code *)0x13d671;
                RVar21 = ra_allocref((ASMState *)local_508,uVar42,0xbfeb);
              }
              bVar50 = (byte)RVar21 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              xVar32 = XO_MOVto;
              goto LAB_0013d68d;
            }
            *(IRRef2 *)(pbVar33 + -6) = (pIVar34->field_1).op12;
            if (iVar37 == 0) {
              pbVar33 = pbVar33 + -6;
              bVar50 = 2;
            }
            else if (uVar55 < 0x12000000) {
              pbVar33[-7] = bVar50;
              pbVar33 = pbVar33 + -7;
              bVar50 = 0x42;
            }
            else {
              *(int *)(pbVar33 + -10) = iVar37;
              pbVar33 = pbVar33 + -10;
              bVar50 = 0x82;
            }
            pbVar33[-1] = bVar50;
            pbVar33[-2] = 199;
            local_508._128_8_ = pbVar33 + -2;
LAB_0013d872:
          }
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
        }
        IVar39.field_0 = IVar39.field_0 + 1;
      } while (IVar30 != IVar39);
    }
    if ((char)local_51c == '\x01' && local_3f0 == (GCtrace *)0x0) {
      pcStack_530 = (code *)0x13d8d9;
      asm_stack_check((ASMState *)local_508,(BCReg)local_404,(IRIns *)0x0,local_508._168_4_ & 0xbfef
                      ,(ExitNo)local_518);
    }
  }
switchD_0013d97d_caseD_c:
  do {
    local_440 = local_440 - 1;
    if (local_440 <= local_43c) goto LAB_0014136e;
    pIVar34 = (IRIns *)(local_508._144_8_ + (ulong)local_440 * 8);
    pcStack_530 = (code *)0x13d90e;
    asm_snap_prev((ASMState *)local_508);
  } while (((((char)(pIVar34->field_1).r < '\0') && ((pIVar34->field_1).s == '\0')) &&
           ((((pIVar34->field_1).t.irt | 0x60) & lj_ir_mode[(pIVar34->field_1).o]) < 0x60)) &&
          ((local_450 & 0x40000) != 0));
  auVar58 = extraout_XMM0;
  if ((char)(pIVar34->field_1).t.irt < '\0') {
    pcStack_530 = (code *)0x13d94b;
    asm_snap_prep((ASMState *)local_508);
    auVar58 = extraout_XMM0_00;
  }
  uVar9 = local_508._144_8_;
  if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
  switch((pIVar34->field_1).o) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\n':
    goto switchD_0013d97d_caseD_0;
  case '\b':
  case '\t':
    if ((*(char *)((long)pIVar34 + -3) == ':') && (local_440 - 1 == (uint)(pIVar34->field_0).op1)) {
      pcStack_530 = (code *)0x13db4e;
      local_440 = (uint)(pIVar34->field_0).op1;
      asm_href((ASMState *)local_508,pIVar34 + -1,(uint)(pIVar34->field_1).o);
    }
    else {
switchD_0013d97d_caseD_0:
      pcStack_530 = (code *)0x13d98c;
      asm_comp((ASMState *)local_508,pIVar34);
    }
    goto switchD_0013d97d_caseD_c;
  case '\v':
    RVar21 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
    if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
      pcStack_530 = (code *)0x13e5dd;
      RVar21 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
    }
    bVar50 = (byte)RVar21 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
    pcStack_530 = (code *)0x13e607;
    RVar15 = ra_scratch((ASMState *)local_508,~(1 << (RVar21 & 0x1f)) & 0xbfef);
    local_528 = *(IRIns *)(local_508._144_8_ + ((ulong)(pIVar34->field_0).op2 + 1) * 8);
    bVar50 = *(byte *)((long)local_528 + -3);
    BVar43 = (BCReg)local_404 - (bVar50 + 2);
    BVar26 = 0;
    if (0 < (int)BVar43) {
      BVar26 = BVar43;
    }
    local_404._0_4_ = BVar26;
    *(byte *)(local_508._144_8_ + 0x40004) = *(byte *)(local_508._144_8_ + 0x40004) | 0x20;
    pcStack_530 = (code *)0x13e66d;
    emit_rma((ASMState *)local_508,XO_MOVto,RVar21 | 0x80200,
             ((jit_State *)(local_508._152_8_ + -0xc48))->penalty + 0x3c);
    pcStack_530 = (code *)0x13e686;
    emit_gri((ASMState *)local_508,0x838100,RVar21 | 0x80200,-((uint)bVar50 * 8 + 0x10));
    pcStack_530 = (code *)0x13e693;
    asm_guardcc((ASMState *)local_508,5);
    pcStack_530 = (code *)0x13e6af;
    emit_rmro((ASMState *)local_508,XO_CMP,RVar15 | 0x80200,RVar21,-8);
    pcStack_530 = (code *)0x13e6bd;
    emit_loadu64((ASMState *)local_508,RVar15,(uint64_t)local_528);
  case '\f':
  case 'Z':
  case 'd':
    goto switchD_0013d97d_caseD_c;
  default:
    ((TValue *)(local_508._152_8_ + 0xc10))->n = (double)(pIVar34->field_1).o;
    pcStack_530 = (code *)0x142011;
    lj_trace_err_info((jit_State *)local_508._152_8_,LJ_TRERR_NYIIR);
  case '\x0f':
    iVar37 = local_404._4_4_;
    for (pIVar18 = (IRIns *)(local_508._144_8_ + (ulong)(local_43c + 1) * 8); pIVar18 < pIVar34;
        pIVar18 = pIVar18 + 1) {
      if (((byte)((pIVar18->field_1).o + 0xaf) < 4) &&
         ((-1 < (char)(pIVar18->field_1).r || ((pIVar18->field_1).s != '\0')))) {
        iVar37 = iVar37 + 1;
        local_404._4_4_ = iVar37;
      }
    }
    if (iVar37 != 0) {
      pcStack_530 = (code *)0x13e717;
      asm_gc_check((ASMState *)local_508);
    }
    local_404._4_4_ = -0x80000000;
    goto switchD_0013d97d_caseD_c;
  case '\x10':
    if (*(char *)((long)pIVar34 + -2) < '\0') {
      bVar57 = *(char *)((long)pIVar34 + -1) == '\0';
    }
    else {
      bVar57 = false;
    }
    if ((char)(pIVar34->field_1).r < '\0') {
      bVar56 = (local_450 & 0x40000) == 0;
      if ((!bVar56) && ((pIVar34->field_1).s == '\0')) goto switchD_0013d97d_caseD_c;
    }
    else {
      bVar56 = (local_450 & 0x40000) == 0;
    }
    uVar38 = *(byte *)((long)pIVar34 + -3) - 0x5f;
    if (((uVar38 < 5) && (uVar38 != 1)) && ((bool)((bVar56 ^ 1U) & bVar57))) {
      pcStack_530 = (code *)0x13fc24;
      ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,1);
    }
    goto switchD_0013d97d_caseD_c;
  case '\x11':
    local_428 = local_42c;
    if (local_404._4_4_ != 0) {
      pcStack_530 = (code *)0x13e99a;
      asm_gc_check((ASMState *)local_508);
    }
    local_40c = 0;
    local_3c8 = (undefined1  [16])0x0;
    if (local_410 != 0xffffffff) {
      local_410 = 0;
    }
    uVar38 = 0;
    if (uStack_454 != 0) {
      uVar52 = 0;
      uVar55 = uStack_454;
      do {
        do {
          uVar42 = 0;
          if (uVar55 != 0) {
            for (; (uVar55 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          bVar50 = *(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_3b0 + (ulong)uVar42 * 2) * 8 + 6);
          if (uVar42 == bVar50) {
            uVar51 = 1 << ((byte)uVar42 & 0x1f);
          }
          else {
            uVar51 = 1 << ((byte)uVar42 & 0x1f);
            if (((uint)local_508._168_4_ >> (uVar42 & 0x1f) & 1) == 0) {
              if ((*(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_508 + (ulong)uVar42 * 4) * 8 + 4) & 0x20) != 0)
              {
                uVar38 = uVar38 | uVar51;
                uVar42 = 0;
                if (-1 < (char)bVar50) {
                  uVar42 = 1 << (bVar50 & 0x1f);
                }
                uVar52 = uVar52 | uVar42;
                goto LAB_0013eaa8;
              }
              local_528.field_1.op12 = uVar52;
              pcStack_530 = (code *)0x13ea44;
              ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar42 * 4));
              uVar52 = local_528._0_4_;
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
            }
            if (-1 < (char)bVar50) {
              local_528.field_1.op12 = uVar52;
              pcStack_530 = (code *)0x13ea78;
              ra_rename((ASMState *)local_508,(uint)bVar50,uVar42);
              uVar52 = local_528._0_4_;
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
            }
          }
LAB_0013eaa8:
          uVar55 = uVar55 & ~uVar51;
        } while (uVar55 != 0);
        if (uVar38 == 0) {
          uVar38 = uStack_454;
          break;
        }
        if ((local_508._168_4_ & uVar38) == 0) {
          pcStack_530 = (code *)0x13eadb;
          asm_phi_break((ASMState *)local_508,uVar38,uVar52,0xbfef);
          pcStack_530 = (code *)0x13eaed;
          asm_phi_break((ASMState *)local_508,uVar38,uVar52,0xffff0000);
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
        }
        uVar38 = 0;
        uVar52 = 0;
        uVar55 = uStack_454;
      } while (uStack_454 != 0);
    }
    uVar38 = ~(uVar38 | local_508._168_4_) & RStack_45c & 0xffff0000;
    while (uVar38 != 0) {
      uVar55 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      pcStack_530 = (code *)0x13fca1;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar55 * 4));
      uVar38 = uVar38 & ~(1 << (uVar55 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
    }
    uVar38 = ~(uStack_454 | local_508._168_4_) & RStack_45c;
    while (uVar38 != 0) {
      uVar55 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      pcStack_530 = (code *)0x13fcec;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar55 * 4));
      uVar38 = uVar38 & ~(1 << (uVar55 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
    }
    pbVar33 = (byte *)local_508._128_8_;
    for (uVar38 = uStack_454; local_508._128_8_ = pbVar33, uVar38 != 0;
        uVar38 = uVar38 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50)) {
      uVar42 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8 | uVar38 << 0x18;
      uVar55 = 0x1f;
      if (uVar42 != 0) {
        for (; uVar42 >> uVar55 == 0; uVar55 = uVar55 - 1) {
        }
      }
      uVar55 = uVar55 ^ 0x18;
      uVar13 = *(ushort *)(local_3b0 + (ulong)uVar55 * 2);
      uVar29 = (ulong)uVar13;
      if (*(char *)(local_508._144_8_ + uVar29 * 8 + 7) != '\0') {
        pIVar34 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
        (pIVar34->field_1).t.irt = (pIVar34->field_1).t.irt & 0xdf;
        bVar50 = *(byte *)(local_508._144_8_ + uVar29 * 8 + 6);
        if ((char)bVar50 < '\0') {
          pcStack_530 = (code *)0x13fd62;
          RVar21 = ra_allocref((ASMState *)local_508,(uint)uVar13,1 << ((byte)uVar55 & 0x1f));
          bVar50 = (byte)RVar21;
        }
        uStack_458 = uStack_458 & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
        pcStack_530 = (code *)0x13fd92;
        emit_storeofs((ASMState *)local_508,pIVar34,uVar55,4,(uint)(pIVar34->field_1).s << 2);
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
      }
      bVar50 = (byte)uVar55 & 0x1f;
      pbVar33 = (byte *)local_508._128_8_;
    }
    uVar29 = (ulong)(local_438 - 1);
    if (*(char *)(local_508._144_8_ + uVar29 * 8 + 5) == '\x13') {
      pIVar34 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
      bVar50 = 0;
      bVar57 = false;
      do {
        if (((pIVar34->field_1).s != '\0') &&
           (*(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 7) != '\0')) {
          bVar56 = (byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2;
          bVar50 = bVar50 | bVar56 + 1U;
          bVar57 = (bool)(bVar57 | !bVar56);
        }
        pcVar1 = (char *)((long)pIVar34 + -3);
        pIVar34 = pIVar34 + -1;
      } while (*pcVar1 == '\x13');
      if (bVar57) {
        if ((unique0x100021d0 & (undefined1  [16])0xbfef) == (undefined1  [16])0x0) {
          uVar36 = 0;
          uVar38 = -(uint)((0x605fd9U >>
                            (*(uint *)(local_508._144_8_ + (ulong)(ushort)local_508._0_2_ * 8 + 4) &
                            0x1f) & 1) != 0) & 0x80200;
          pbVar33[-1] = 0x24;
          pbVar33[-3] = 0x8b;
          pbVar33[-2] = 4;
          if ((short)uVar38 == 0) {
            local_508._128_8_ = pbVar33 + -3;
          }
          else {
            local_508._128_8_ = pbVar33 + -4;
            pbVar33[-4] = (byte)(uVar38 >> 0x10) | 0x40;
          }
          uVar29 = (ulong)(local_438 - 1);
          if (*(char *)(local_508._144_8_ + uVar29 * 8 + 5) == '\x13') goto LAB_00140ce5;
        }
        else {
          uVar38 = 0;
          if ((unique0x100021d0 & (undefined1  [16])0xbfef) != (undefined1  [16])0x0) {
            for (; ((local_508._168_4_ & 0xbfef) >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar36 = (ulong)uVar38;
LAB_00140ce5:
          pIVar34 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
          do {
            if ((pIVar34->field_1).s != '\0') {
              bVar54 = *(byte *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 7);
              if ((bVar54 != 0) && (1 < (byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd))) {
                pcStack_530 = (code *)0x140d32;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8),
                              (Reg)uVar36,4,(uint)bVar54 << 2);
                pcStack_530 = (code *)0x140d4d;
                emit_loadofs((ASMState *)local_508,pIVar34,(Reg)uVar36,4,
                             (uint)(pIVar34->field_1).s << 2);
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
              }
            }
            pcVar1 = (char *)((long)pIVar34 + -3);
            pIVar34 = pIVar34 + -1;
          } while (*pcVar1 == '\x13');
        }
        if (((uint)local_508._168_4_ >> ((uint)uVar36 & 0x1f) & 1) == 0) {
          pcStack_530 = (code *)0x140da1;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar36 * 4) * 8
                                 ),(uint)uVar36,4,0);
        }
      }
      if ((bVar50 & 2) != 0) {
        uVar38 = 0;
        bVar57 = (stack0xfffffffffffffba0 & (undefined1  [16])0xffff0000) != (undefined1  [16])0x0;
        if (bVar57) {
          for (; ((local_508._168_4_ & 0xffff0000) >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
          }
        }
        uVar29 = 0x10;
        if (bVar57) {
          uVar29 = (ulong)uVar38;
        }
        uVar38 = (uint)uVar29;
        if (((uint)local_508._168_4_ >> (uVar38 & 0x1f) & 1) == 0) {
          pcStack_530 = (code *)0x140dfd;
          emit_loadofs((ASMState *)local_508,
                       (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar29 * 4) * 8)
                       ,uVar38,4,0);
        }
        if (*(char *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
          pIVar34 = (IRIns *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8);
          do {
            if ((pIVar34->field_1).s != '\0') {
              bVar50 = *(byte *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 7);
              if ((bVar50 != 0) && ((byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2)) {
                pcStack_530 = (code *)0x140e65;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8),
                              uVar38,4,(uint)bVar50 << 2);
                pcStack_530 = (code *)0x140e80;
                emit_loadofs((ASMState *)local_508,pIVar34,uVar38,4,(uint)(pIVar34->field_1).s << 2)
                ;
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
              }
            }
            pcVar1 = (char *)((long)pIVar34 + -3);
            pIVar34 = pIVar34 + -1;
          } while (*pcVar1 == '\x13');
        }
        if ((local_508._168_4_ & 1 << ((byte)uVar29 & 0x1f)) == 0) {
          pcStack_530 = (code *)0x140ed1;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar29 * 4) * 8
                                 ),uVar38,4,0);
        }
      }
    }
    iVar37 = (int)local_508._128_8_;
    if (local_3b8 == (byte *)0x0) {
      local_3e0[-5] = 0xe9;
      if (local_44c == 0) {
        iVar27 = iVar37 - (int)local_3e0;
        lVar23 = 3;
        lVar47 = -4;
        pbVar31 = local_3e0;
LAB_00140f79:
        *(int *)(local_3e0 + lVar47) = iVar27;
        pbVar19 = (byte *)(local_508._128_8_ + lVar23);
      }
      else {
        pbVar31 = local_3e0 + -5;
        iVar27 = iVar37 - (int)pbVar31;
        *(int *)(local_3e0 + -9) = iVar27;
        if (local_44c == 2) {
          iVar27 = iVar27 + 6;
          lVar23 = 8;
          lVar47 = -0xf;
          goto LAB_00140f79;
        }
        pbVar19 = (byte *)(local_508._128_8_ + 4);
      }
      if (pbVar31 + -0x80 <= pbVar19) {
        local_3b8 = pbVar19;
        local_440 = local_43c;
        local_3f8->nins = local_438;
      }
    }
    else {
      local_3b8 = (byte *)0x0;
      if (local_44c == 0) {
        local_3e0[-1] = (char)local_508._128_8_ - (char)local_3e0;
        local_3e0[-2] = 0xeb;
      }
      else {
        local_3e0[-5] = 0xe9;
        bVar50 = (char)local_508._128_8_ - ((char)local_3e0 + -5);
        local_3e0[-6] = bVar50;
        if (local_44c == 2) {
          local_3e0[-8] = bVar50 + 2;
        }
      }
    }
    local_3d0 = (byte *)local_508._128_8_;
    if ((byte *)local_508._128_8_ != pbVar33) {
      *(int *)(local_508._128_8_ + -4) = (int)pbVar33 - iVar37;
      *(byte *)(local_508._128_8_ + -5) = 0xe9;
      local_508._128_8_ = local_508._128_8_ + -5;
      goto LAB_00140fdf;
    }
    goto switchD_0013d97d_caseD_c;
  case '\x12':
    bVar50 = *(byte *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
    if ((char)bVar50 < '\0') {
      RVar53 = 0xbfef;
      if ((byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2) {
        RVar53 = 0xffff0000;
      }
      pcStack_530 = (code *)0x13e555;
      RVar21 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,RVar53);
      bVar50 = (byte)RVar21;
    }
    uStack_458 = uStack_458 & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
    goto switchD_0013d97d_caseD_c;
  case '\x13':
    uVar38 = 0xbfef;
    if ((byte)(((pIVar34->field_1).t.irt & 0x1f) - 0xd) < 2) {
      uVar38 = 0xffff0000;
    }
    if ((pIVar34->field_1).r != 0xfe) {
      uVar29 = (ulong)(pIVar34->field_0).op1;
      if (*(char *)(local_508._144_8_ + uVar29 * 8 + 7) == '\0') {
        pIVar18 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op2 * 8);
        if ((pIVar18->field_1).s == '\0') {
          uVar38 = uVar38 & ~uStack_454;
          if ((local_508._168_4_ & uVar38 & (local_508._168_4_ & uVar38) - 1) != 0) {
            if ((char)(pIVar18->field_1).r < '\0') {
              pcStack_530 = (code *)0x140924;
              RVar21 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op2,uVar38);
            }
            else {
              pcStack_530 = (code *)0x140297;
              RVar21 = ra_scratch((ASMState *)local_508,uVar38);
              pcStack_530 = (code *)0x1402ab;
              emit_movrr((ASMState *)local_508,pIVar18,RVar21,(uint)(pIVar18->field_1).r);
            }
            bVar50 = (byte)RVar21;
            (pIVar34->field_1).r = bVar50;
            uStack_454 = uStack_454 | 1 << (bVar50 & 0x1f);
            *(IRRef1 *)(local_3b0 + (ulong)RVar21 * 2) = (pIVar34->field_0).op1;
            pbVar33 = (byte *)(uVar9 + uVar29 * 8 + 4);
            *pbVar33 = *pbVar33 | 0x20;
            if (*(char *)(uVar9 + uVar29 * 8 + 6) < '\0') {
              *(byte *)(uVar9 + uVar29 * 8 + 6) = bVar50 | 0x80;
            }
            goto switchD_0013d97d_caseD_c;
          }
          if ((*(char *)(local_508._144_8_ + uVar29 * 8 + 6) < '\0') &&
             ((char)(pIVar18->field_1).r < '\0')) {
            pcStack_530 = (code *)0x13e8af;
            ra_spill((ASMState *)local_508,pIVar34);
            (pIVar18->field_1).s = (pIVar34->field_1).s;
            goto switchD_0013d97d_caseD_c;
          }
        }
      }
      pcStack_530 = (code *)0x141fed;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYIPHI);
    }
    goto switchD_0013d97d_caseD_c;
  case '\x15':
    pcStack_530 = (code *)0x13ec78;
    asm_guardcc((ASMState *)local_508,5);
    *(byte *)(local_508._128_8_ + -1) = 0x80;
    addr = (void *)((long)&((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x2d].val + 1);
    xVar32 = XO_GROUP3b;
    RVar21 = 0;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
    goto LAB_0013eca6;
  case '\x1f':
    pcStack_530 = (code *)0x13e81d;
    asm_neg_not((ASMState *)local_508,pIVar34,XOg_NOT);
    goto switchD_0013d97d_caseD_c;
  case ' ':
    pcStack_530 = (code *)0x13e4c8;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    uVar38._0_2_ = *(IROpT *)((long)pIVar34 + 4);
    uVar38._2_2_ = *(IRRef1 *)((long)pIVar34 + 6);
    uVar38 = -(uint)((0x605fd9U >> (uVar38 & 0x1f) & 1) != 0) & 0x80200;
    *(Reg *)(local_508._128_8_ + -4) = (RVar21 & 7) << 0x18 | 0xc80f00fd;
    uVar55 = RVar21 >> 3 & 1;
    if ((uVar38 >> 1 & 0xffff) == 0 && uVar55 == 0) {
      local_508._128_8_ = local_508._128_8_ + -2;
    }
    else {
      *(byte *)(local_508._128_8_ + -3) = (byte)(uVar38 >> 0x10) | (byte)uVar55 | 0x40;
      local_508._128_8_ = local_508._128_8_ + -3;
    }
    pcStack_530 = (code *)0x13fc5d;
    ra_left((ASMState *)local_508,RVar21,(uint)(pIVar34->field_0).op1);
    goto switchD_0013d97d_caseD_c;
  case '!':
    pcStack_530 = (code *)0x13e5af;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_AND);
    goto switchD_0013d97d_caseD_c;
  case '\"':
    pcStack_530 = (code *)0x13eb64;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_OR);
    goto switchD_0013d97d_caseD_c;
  case '#':
    pcStack_530 = (code *)0x13e49d;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_XOR);
    goto switchD_0013d97d_caseD_c;
  case '$':
    pcStack_530 = (code *)0x13e8f5;
    asm_bitshift((ASMState *)local_508,pIVar34,XOg_SHL,XV_SHLX);
    goto switchD_0013d97d_caseD_c;
  case '%':
    pcStack_530 = (code *)0x13e806;
    asm_bitshift((ASMState *)local_508,pIVar34,XOg_SHR,XV_SHRX);
    goto switchD_0013d97d_caseD_c;
  case '&':
    pcStack_530 = (code *)0x13eb4d;
    asm_bitshift((ASMState *)local_508,pIVar34,XOg_SAR,XV_SARX);
    goto switchD_0013d97d_caseD_c;
  case '\'':
    xs = XOg_ROL;
    goto LAB_0013eb76;
  case '(':
    xs = XOg_ROR;
LAB_0013eb76:
    pcStack_530 = (code *)0x13eb7d;
    asm_bitshift((ASMState *)local_508,pIVar34,xs,XOg_FADDq);
    goto switchD_0013d97d_caseD_c;
  case ')':
    uVar38 = (pIVar34->field_1).t.irt & 0x1f;
    if (uVar38 != 0xe) {
      if ((local_3c8._8_8_ != local_508._128_8_) && ((0x605fd9U >> uVar38 & 1) == 0)) {
        uVar36 = (ulong)(pIVar34->field_0).op1;
        uVar29 = (ulong)(pIVar34->field_0).op2;
        local_508._164_2_ = 0x8080;
        local_508[0xa6] = '\0';
        local_508._160_4_ = 0;
        cVar2 = *(char *)(local_508._144_8_ + uVar36 * 8 + 6);
        if (cVar2 < '\0') {
          if ((((pIVar34->field_0).op1 != (pIVar34->field_0).op2) &&
              (*(char *)(local_508._144_8_ + uVar36 * 8 + 5) == ')')) &&
             ((local_410 < (pIVar34->field_0).op1 &&
              ((-1 < (short)(pIVar34->field_0).op2 ||
               (-1 < *(short *)(local_508._144_8_ + uVar36 * 8 + 2))))))) {
            cVar2 = *(char *)(local_508._144_8_ +
                             (ulong)(((IRIns *)(local_508._144_8_ + uVar36 * 8))->field_0).op1 * 8 +
                             6);
            uVar38 = (uint)cVar2;
            if (cVar2 < '\0') {
              pcStack_530 = (code *)0x141094;
              uVar38 = ra_allocref((ASMState *)local_508,
                                   (uint)(((IRIns *)(local_508._144_8_ + uVar36 * 8))->field_0).op1,
                                   0xbfef);
            }
            uVar55 = uStack_458 & ~(1 << (uVar38 & 0x1f));
            uStack_458 = uVar55;
            uVar42 = ~(1 << (uVar38 & 0x1f)) & 0xbfef;
            local_508[0xa4] = (uint8_t)uVar38;
            if ((short)(pIVar34->field_0).op2 < 0) {
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar9 + uVar36 * 8 + 2) * 8))
                   ->field_1).op12;
              uVar13 = (pIVar34->field_0).op2;
            }
            else {
              local_508._160_4_ = (((IRIns *)(uVar9 + uVar29 * 8))->field_1).op12;
              uVar13 = *(ushort *)(uVar9 + uVar36 * 8 + 2);
            }
            cVar2 = *(char *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6);
            uVar38 = (uint)cVar2;
            if (cVar2 < '\0') {
              pcStack_530 = (code *)0x141332;
              uVar38 = ra_allocref((ASMState *)local_508,(uint)uVar13,uVar42);
              uVar55 = uStack_458;
            }
            uStack_458 = uVar55 & ~(1 << (uVar38 & 0x1f));
            RVar53 = uVar42 & ~(1 << (uVar38 & 0x1f));
            local_508[0xa5] = (char)uVar38;
            goto LAB_0014134d;
          }
        }
        else {
          RVar53 = ~(1 << ((int)cVar2 & 0x1fU)) & 0xbfef;
          uStack_458 = uStack_458 & ~(1 << ((int)cVar2 & 0x1fU));
          local_508[0xa4] = *(undefined1 *)(local_508._144_8_ + uVar36 * 8 + 6);
          local_508[0xa5] = 0x80;
          uVar13 = (pIVar34->field_0).op2;
          if (((short)uVar13 < 0) && (*(char *)(local_508._144_8_ + uVar29 * 8 + 6) < '\0')) {
            if (((*(char *)(local_508._144_8_ + uVar29 * 8 + 5) == ')') && (local_410 < uVar13)) &&
               (-1 < *(short *)(local_508._144_8_ + uVar29 * 8 + 2))) {
              pcStack_530 = (code *)0x1412d8;
              RVar21 = ra_alloc1((ASMState *)local_508,
                                 (uint)(((IRIns *)(local_508._144_8_ + uVar29 * 8))->field_0).op1,
                                 RVar53);
              RVar53 = RVar53 & ~(1 << (RVar21 & 0x1f));
              local_508[0xa5] = (char)RVar21;
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar9 + uVar29 * 8 + 2) * 8))
                   ->field_1).op12;
LAB_0014134d:
              pcStack_530 = (code *)0x14135f;
              uVar38 = ra_dest((ASMState *)local_508,pIVar34,RVar53);
              xVar32 = XO_LEA;
              break;
            }
          }
          else {
            bVar50 = (pIVar34->field_1).r;
            if (((long)(char)bVar50 < 0) ||
               ((((*(byte *)(local_508._144_8_ + uVar36 * 8 + 4) & 0x40) == 0 ||
                 (*(IRRef1 *)(local_3b0 + (long)(char)bVar50 * 2) != (pIVar34->field_0).op1)) &&
                (((*(byte *)(local_508._144_8_ + uVar29 * 8 + 4) & 0x40) == 0 ||
                 (*(ushort *)(local_3b0 + (ulong)bVar50 * 2) != uVar13)))))) {
              if ((short)uVar13 < 0) {
                uVar38 = (uint)*(byte *)(local_508._144_8_ + uVar29 * 8 + 6);
                RVar53 = RVar53 & ~(1 << (uVar38 & 0x1f));
                uStack_458 = uStack_458 & ~(1 << (uVar38 & 0x1f));
                local_508[0xa5] = *(undefined1 *)(local_508._144_8_ + uVar29 * 8 + 6);
              }
              else {
                local_508._160_4_ = (((IRIns *)(local_508._144_8_ + uVar29 * 8))->field_1).op12;
              }
              goto LAB_0014134d;
            }
          }
        }
      }
      goto switchD_0013d97d_caseD_35;
    }
    pcStack_530 = (code *)0x13ebf3;
    asm_fparith((ASMState *)local_508,pIVar34,XO_ADDSD);
    goto switchD_0013d97d_caseD_c;
  case '*':
    if (((pIVar34->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013d97d_caseD_36;
    pcStack_530 = (code *)0x13ec4a;
    asm_fparith((ASMState *)local_508,pIVar34,XO_SUBSD);
    goto switchD_0013d97d_caseD_c;
  case '+':
    if (((pIVar34->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013d97d_caseD_37;
    pcStack_530 = (code *)0x13ec13;
    asm_fparith((ASMState *)local_508,pIVar34,XO_MULSD);
    goto switchD_0013d97d_caseD_c;
  case ',':
    bVar50 = (pIVar34->field_1).t.irt & 0x1f;
    if (bVar50 != 0xe) {
      id_00 = bVar50 == 0x15 ^ IRCALL_lj_carith_divu64;
      goto LAB_0013f64b;
    }
    pcStack_530 = (code *)0x13ebcc;
    asm_fparith((ASMState *)local_508,pIVar34,XO_DIVSD);
    goto switchD_0013d97d_caseD_c;
  case '-':
    bVar50 = (pIVar34->field_1).t.irt & 0x1f;
    if (bVar50 == 0x13) {
      auVar58 = pmovzxwd(auVar58,*pIVar34);
      local_138.field_4.i = auVar58._0_4_;
      local_138.u64._4_2_ = auVar58._4_2_;
      local_138.u64._6_2_ = auVar58._6_2_;
      pCVar35 = lj_ir_callinfo + 0x30;
LAB_0013edcf:
      pcStack_530 = (code *)0x13ede2;
      asm_setupresult((ASMState *)local_508,pIVar34,pCVar35);
      goto LAB_0013ede8;
    }
    id_00 = bVar50 == 0x15 ^ IRCALL_lj_carith_modu64;
    goto LAB_0013f64b;
  case '.':
    bVar50 = (pIVar34->field_1).t.irt & 0x1f;
    if (bVar50 != 0xe) {
      id_00 = bVar50 == 0x15 ^ IRCALL_lj_carith_powu64;
      goto LAB_0013f64b;
    }
    if ((*(byte *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op2 * 8 + 4) & 0x1f) == 0xe) {
      local_138.field_4.i = (int32_t)(pIVar34->field_0).op1;
      local_138.u64._6_2_ = 0;
      pCVar35 = lj_ir_callinfo + 0x46;
      local_138.u64._4_2_ = (pIVar34->field_0).op2;
      goto LAB_0013edcf;
    }
    bVar50 = (pIVar34->field_1).r & 0x1f;
    RVar53 = (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50) & 0x30001;
    if ((char)(pIVar34->field_1).r < '\0') {
      RVar53 = 0x30001;
    }
    pcStack_530 = (code *)0x14018c;
    ra_evictset((ASMState *)local_508,RVar53);
    pcStack_530 = (code *)0x14019c;
    ra_destreg((ASMState *)local_508,pIVar34,0x10);
    pcStack_530 = (code *)0x1401ab;
    emit_call_((ASMState *)local_508,(MCode *)lj_vm_powi_sse);
    pcStack_530 = (code *)0x1401bc;
    ra_left((ASMState *)local_508,0x10,(uint)(pIVar34->field_0).op1);
    pcStack_530 = (code *)0x1401ca;
    ra_left((ASMState *)local_508,0,(uint)(pIVar34->field_0).op2);
    goto switchD_0013d97d_caseD_c;
  case '/':
    if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13ee51;
      asm_fparith((ASMState *)local_508,pIVar34,XO_XORPS);
    }
    else {
      pcStack_530 = (code *)0x13f710;
      asm_neg_not((ASMState *)local_508,pIVar34,XOg_NEG);
    }
    goto switchD_0013d97d_caseD_c;
  case '0':
    pcStack_530 = (code *)0x13eb31;
    asm_fparith((ASMState *)local_508,pIVar34,XO_ANDPS);
    goto switchD_0013d97d_caseD_c;
  case '1':
    bVar50 = (pIVar34->field_1).s;
    iVar37 = (uint)bVar50 * 4;
    bVar54 = (pIVar34->field_1).r;
    if (-1 < (char)bVar54) {
      iVar27 = 1 << (bVar54 & 0x1f);
      uVar29 = CONCAT44(iVar27,iVar27) | stack0xfffffffffffffba0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar29;
      stack0xfffffffffffffba0 = uVar29;
      pcStack_530 = (code *)0x13e951;
      emit_rmro((ASMState *)local_508,XO_MOVSD,(int)(char)bVar54,4,iVar37);
    }
    if (bVar50 == 0) {
      bVar50 = 0x1c;
    }
    else if (bVar50 < 0x20) {
      *(byte *)(local_508._128_8_ + -1) = (byte)iVar37;
      local_508._128_8_ = local_508._128_8_ + -1;
      bVar50 = 0x5c;
    }
    else {
      *(int *)(local_508._128_8_ + -4) = iVar37;
      local_508._128_8_ = local_508._128_8_ + -4;
      bVar50 = 0x9c;
    }
    *(byte *)(local_508._128_8_ + -1) = 0x24;
    *(byte *)(local_508._128_8_ + -2) = bVar50;
    *(byte *)(local_508._128_8_ + -3) = 0xdd;
    *(byte *)(local_508._128_8_ + -7) = 0xd9;
    *(byte *)(local_508._128_8_ + -6) = 0xfd;
    *(byte *)(local_508._128_8_ + -5) = 0xdd;
    *(byte *)(local_508._128_8_ + -4) = 0xd9;
    local_508._128_8_ = local_508._128_8_ + -7;
    pcStack_530 = (code *)0x13ff22;
    asm_x87load((ASMState *)local_508,(uint)(pIVar34->field_0).op1);
    pcStack_530 = (code *)0x13ff2e;
    asm_x87load((ASMState *)local_508,(uint)(pIVar34->field_0).op2);
    goto switchD_0013d97d_caseD_c;
  case '2':
    if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13e589;
      asm_fparith((ASMState *)local_508,pIVar34,XO_MINSD);
    }
    else {
      pcStack_530 = (code *)0x13f49b;
      asm_intmin_max((ASMState *)local_508,pIVar34,0xf);
    }
    goto switchD_0013d97d_caseD_c;
  case '3':
    if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x13e8d9;
      asm_fparith((ASMState *)local_508,pIVar34,XO_MAXSD);
    }
    else {
      pcStack_530 = (code *)0x13f4aa;
      asm_intmin_max((ASMState *)local_508,pIVar34,0xc);
    }
    goto switchD_0013d97d_caseD_c;
  case '4':
    uVar13 = (pIVar34->field_0).op2;
    if (uVar13 != 3) {
      if (uVar13 < 3) {
        if ((local_450 & 0x20) == 0) {
          bVar50 = (pIVar34->field_1).r & 0x1f;
          RVar53 = (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50) & 0xf0001;
          if ((char)(pIVar34->field_1).r < '\0') {
            RVar53 = 0xf0001;
          }
          pcStack_530 = (code *)0x13f5f1;
          ra_evictset((ASMState *)local_508,RVar53);
          pcStack_530 = (code *)0x13f601;
          ra_destreg((ASMState *)local_508,pIVar34,0x10);
          pcVar25 = lj_vm_trunc;
          if (uVar13 == 1) {
            pcVar25 = lj_vm_ceil;
          }
          target = lj_vm_floor;
          if (uVar13 != 0) {
            target = pcVar25;
          }
          pcStack_530 = (code *)0x13f62b;
          emit_call_((ASMState *)local_508,(MCode *)target);
          pcStack_530 = (code *)0x13f63c;
          ra_left((ASMState *)local_508,0x10,(uint)(pIVar34->field_0).op1);
        }
        else {
          pcStack_530 = (code *)0x1406f0;
          RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xffff0000);
          pcStack_530 = (code *)0x140704;
          RVar15 = asm_fuseload((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xffff0000);
          *(byte *)(local_508._128_8_ + -1) = (char)uVar13 + 9;
          pcStack_530 = (code *)0x14072e;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          emit_mrm((ASMState *)local_508,XO_ROUNDSD,RVar21,RVar15);
          uVar9 = local_508._128_8_;
          if (*(byte *)(local_508._128_8_ + 1) != 0x3a) {
            *(byte *)local_508._128_8_ = *(byte *)(local_508._128_8_ + 1);
            *(byte *)(local_508._128_8_ + 1) = 0xf;
          }
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          *(byte *)(uVar9 + -1) = 0x66;
        }
      }
      else {
        pcStack_530 = (code *)0x140164;
        asm_callid((ASMState *)local_508,pIVar34,uVar13 + IRCALL_lj_vm_floor);
      }
      goto switchD_0013d97d_caseD_c;
    }
    pcStack_530 = (code *)0x13ed63;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xffff0000);
    pcStack_530 = (code *)0x13ed77;
    RVar15 = asm_fuseload((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xffff0000);
    xVar32 = XO_SQRTSD;
    goto LAB_0013ed82;
  case '5':
switchD_0013d97d_caseD_35:
    pcStack_530 = (code *)0x140c35;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_ADD);
    goto switchD_0013d97d_caseD_c;
  case '6':
switchD_0013d97d_caseD_36:
    pcStack_530 = (code *)0x13ec61;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_SUB);
    goto switchD_0013d97d_caseD_c;
  case '7':
switchD_0013d97d_caseD_37:
    pcStack_530 = (code *)0x13ec2a;
    asm_intarith((ASMState *)local_508,pIVar34,XOg_X_IMUL);
    goto switchD_0013d97d_caseD_c;
  case '8':
    pcStack_530 = (code *)0x13e1b2;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    pcStack_530 = (code *)0x13e1c4;
    asm_fusearef((ASMState *)local_508,pIVar34,0xbfef);
    uVar38 = RVar21 | 0x80200;
    xVar32 = XO_LEA;
    break;
  case '9':
    local_528.gcr.gcptr64._2_6_ = 0;
    local_528.field_0.op1 =
         (((IRIns *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op2 * 8))->field_0).op1;
    uVar13 = *(ushort *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op2 * 8 + 2);
    if (((char)(pIVar34->field_1).r < '\0') && ((pIVar34->field_1).s == '\0')) {
      RVar21 = 0x80;
    }
    else {
      pcStack_530 = (code *)0x13e767;
      RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    }
    uVar38 = (uint)*(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
    if ((int)uVar38 < 0) {
      pcStack_530 = (code *)0x13e78d;
      uVar38 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
    }
    iVar37 = (uint)uVar13 * 0x18;
    bVar50 = (byte)uVar38;
    uStack_458 = uStack_458 & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
    if (RVar21 < 0x80) {
      if (uVar13 == 0) {
        if (RVar21 != uVar38) {
          *(byte *)(local_508._128_8_ + -1) = (bVar50 & 7) + (char)RVar21 * '\b' | 0xc0;
          *(byte *)(local_508._128_8_ + -2) = 0x8b;
          *(byte *)(local_508._128_8_ + -3) =
               (byte)(uVar38 >> 3) & 1 | (byte)(RVar21 >> 1) & 4 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -3;
        }
      }
      else if (RVar21 == uVar38) {
        pcStack_530 = (code *)0x13e7ea;
        emit_gri((ASMState *)local_508,0x838100,RVar21 | 0x80200,iVar37);
      }
      else {
        pcStack_530 = (code *)0x140477;
        emit_rmro((ASMState *)local_508,XO_LEA,RVar21 | 0x80200,uVar38,iVar37);
      }
    }
    pcStack_530 = (code *)0x140486;
    asm_guardcc((ASMState *)local_508,5);
    IVar30 = local_528;
    bVar54 = *(byte *)(uVar9 + (long)local_528 * 8 + 4) & 0x1f;
    if (bVar54 < 3) {
      *(uint *)(local_508._128_8_ + -4) = (int)(char)~bVar54 << 0xf | 0x7fff;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x1404d3;
      emit_rmro((ASMState *)local_508,XO_ARITHi,7,uVar38,iVar37 + 0xc);
    }
    else {
      pcStack_530 = (code *)0x1404f2;
      RVar21 = ra_scratch((ASMState *)local_508,~(1 << (bVar50 & 0x1f)) & 0xbfef);
      pcStack_530 = (code *)0x140512;
      emit_rmro((ASMState *)local_508,XO_CMP,RVar21 | 0x80200,uVar38,iVar37 + 8);
      bVar50 = *(byte *)(uVar9 + (long)IVar30 * 8 + 4) & 0x1f;
      if (bVar50 == 0xe) {
        IVar30 = *(IRIns *)(uVar9 + ((long)IVar30 + 1) * 8);
      }
      else {
        IVar30.field_0 = (long)(char)~bVar50 << 0x2f | *(IRIns *)(uVar9 + ((long)IVar30 + 1) * 8);
      }
      pcStack_530 = (code *)0x140540;
      emit_loadu64((ASMState *)local_508,RVar21,(uint64_t)IVar30);
    }
    goto switchD_0013d97d_caseD_c;
  case ':':
    pcStack_530 = (code *)0x13ee65;
    asm_href((ASMState *)local_508,pIVar34,IR_LT);
    goto switchD_0013d97d_caseD_c;
  case ';':
    if ((pIVar34->field_1).r != 0xfe) {
      pcStack_530 = (code *)0x13e0ed;
      asm_snap_prep((ASMState *)local_508);
      local_138.field_4.i = 0x7fff;
      local_138.u64._4_2_ = (pIVar34->field_0).op1;
      local_138.u64._6_2_ = 0;
      local_130 = 0x7ffd;
      pcStack_530 = (code *)0x13e121;
      asm_setupresult((ASMState *)local_508,pIVar34,lj_ir_callinfo + 0x23);
      pcStack_530 = (code *)0x13e12f;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x23,(IRRef *)&local_138.u64);
      RVar21 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar37 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar29;
      stack0xfffffffffffffba0 = uVar29;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar28 = (IRRef)(pIVar34->field_0).op2;
      goto LAB_0013f6f5;
    }
    goto switchD_0013d97d_caseD_c;
  case '<':
  case '=':
    pcStack_530 = (code *)0x13da2a;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    if ((long)(short)(pIVar34->field_0).op1 < 0) {
      pcStack_530 = (code *)0x13f21d;
      RVar15 = ra_scratch((ASMState *)local_508,0xbfef);
      cVar2 = *(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
      rb = (Reg)cVar2;
      if (cVar2 < '\0') {
        pcStack_530 = (code *)0x13f244;
        rb = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
      }
      bVar50 = (byte)rb & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      RVar21 = RVar21 | 0x80200;
      if ((pIVar34->field_1).o == '=') {
        pcStack_530 = (code *)0x13f286;
        emit_rmro((ASMState *)local_508,XO_LEA,RVar21,RVar15,0x10);
        pcStack_530 = (code *)0x13f293;
        asm_guardcc((ASMState *)local_508,5);
        *(byte *)(local_508._128_8_ + -1) = 1;
        xVar32 = XO_ARITHib;
        RVar21 = 7;
        iVar46 = 10;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
      }
      else {
        xVar32 = XO_MOV;
        iVar46 = 0x20;
      }
      pcStack_530 = (code *)0x13f98e;
      emit_rmro((ASMState *)local_508,xVar32,RVar21,RVar15,iVar46);
      pcStack_530 = (code *)0x13f9b4;
      emit_rmro((ASMState *)local_508,XO_MOV,RVar15 | 0x80200,rb,
                (uint)*(byte *)((long)&(pIVar34->field_0).op2 + 1) * 8 + 0x28);
    }
    else {
      addr = (void *)(*(long *)((long)*(IRIns *)(local_508._144_8_ +
                                                ((long)(short)(pIVar34->field_0).op1 + 1) * 8) +
                                0x28 + (ulong)*(byte *)((long)&(pIVar34->field_0).op2 + 1) * 8) +
                     0x20);
      RVar21 = RVar21 | 0x80200;
      xVar32 = XO_MOV;
LAB_0013eca6:
      pcStack_530 = (code *)0x13ecab;
      emit_rma((ASMState *)local_508,xVar32,RVar21,addr);
    }
    goto switchD_0013d97d_caseD_c;
  case '>':
    pcStack_530 = (code *)0x13ed1e;
    uVar38 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    pcStack_530 = (code *)0x13ed31;
    asm_fusefref((ASMState *)local_508,pIVar34,0xbfef);
    xVar32 = XO_LEA;
    break;
  case '?':
    pcStack_530 = (code *)0x13e38e;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    pcStack_530 = (code *)0x13e3a0;
    asm_tvptr((ASMState *)local_508,RVar21,(uint)(pIVar34->field_0).op1,(uint)(pIVar34->field_0).op2
             );
    goto switchD_0013d97d_caseD_c;
  case '@':
    pcStack_530 = (code *)0x13e2f0;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    local_508[0xa4] = 0x80;
    local_508[0xa5] = 0x80;
    local_508[0xa6] = '\0';
    local_508._160_4_ = 0x18;
    RVar15 = (Reg)*(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
    if ((int)RVar15 < 0) {
      pcStack_530 = (code *)0x13e335;
      RVar15 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
    }
    uVar38 = uStack_458 & ~(1 << (RVar15 & 0x1f));
    uStack_458 = uVar38;
    local_508[0xa4] = (byte)RVar15;
    uVar13 = (pIVar34->field_0).op2;
    if ((short)uVar13 < 0) {
      uVar55 = (uint)*(char *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6);
      if ((int)uVar55 < 0) {
        pcStack_530 = (code *)0x13fac8;
        uVar55 = ra_allocref((ASMState *)local_508,(uint)uVar13,
                             ~(1 << ((byte)RVar15 & 0x1f)) & 0xbfef);
        uVar38 = uStack_458;
      }
      uStack_458 = uVar38 & ~(1 << (uVar55 & 0x1f));
      local_508[0xa5] = (char)uVar55;
    }
    else {
      local_508._160_4_ =
           local_508._160_4_ + (((IRIns *)(local_508._144_8_ + (ulong)uVar13 * 8))->field_1).op12;
    }
    uVar38 = RVar21 | 0x80200;
    xVar32 = XO_LEA;
    break;
  case 'A':
    pcStack_530 = (code *)0x13e189;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    pcStack_530 = (code *)0x13e198;
    ra_left((ASMState *)local_508,RVar21,0x7fff);
    goto switchD_0013d97d_caseD_c;
  case 'B':
  case 'C':
  case 'D':
  case 'H':
    if ((char)(pIVar34->field_1).r < '\0') {
      bVar50 = (byte)(pIVar34->field_0).ot;
      if ((pIVar34->field_1).s != '\0') goto LAB_0013dbbe;
      if ((bVar50 & 0x1f) - 3 < 10) {
        pcStack_530 = (code *)0x13f3c2;
        RVar21 = ra_scratch((ASMState *)local_508,0xbfef);
        uVar29 = (ulong)RVar21;
        RVar53 = ~(1 << (RVar21 & 0x1f)) & 0xbfef;
      }
      else {
        RVar53 = 0xbfef;
        uVar29 = 0x80;
      }
      pcStack_530 = (code *)0x13ff52;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,RVar53);
      if ((pIVar34->field_1).o == 'H') {
        local_508._160_4_ = local_508._160_4_ + (uint)(pIVar34->field_0).op2 * 8;
      }
LAB_0013dc49:
      local_508._160_4_ = local_508._160_4_ + 4;
      pcStack_530 = (code *)0x13dc6f;
      asm_guardcc((ASMState *)local_508,(uint)(((pIVar34->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
      uVar38 = (pIVar34->field_1).t.irt & 0x1f;
      if ((byte)uVar38 < 0xe) {
        if (uVar38 - 3 < 10) {
          local_508._160_4_ = local_508._160_4_ - 4;
          *(byte *)(local_508._128_8_ + -1) = ~(pIVar34->field_1).t.irt | 0xe0;
          uVar38 = (uint)uVar29;
          pcStack_530 = (code *)0x13ddf8;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          emit_mrm((ASMState *)local_508,XO_ARITHi8,7,uVar38);
          *(byte *)(local_508._128_8_ + -1) = 0x2f;
          *(byte *)(local_508._128_8_ + -2) = (byte)uVar29 | 0xf8;
          *(byte *)(local_508._128_8_ + -3) = 0xc1;
          *(byte *)(local_508._128_8_ + -4) = (byte)(uVar29 >> 3) & 1 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -4;
          goto LAB_0013de43;
        }
        if ((byte)uVar38 == 0) {
          local_508._160_4_ = local_508._160_4_ - 4;
          *(byte *)(local_508._128_8_ + -1) = 0xff;
          xVar32 = XO_ARITHi8;
          uVar38 = 0x80207;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          break;
        }
        *(uint *)(local_508._128_8_ + -4) = ~uVar38 << 0xf | 0x7fff;
      }
      else {
        pbVar33 = (byte *)(local_508._128_8_ + -4);
        pbVar33[0] = 0;
        pbVar33[1] = 0;
        pbVar33[2] = 0xf9;
        pbVar33[3] = 0xff;
      }
      local_508._128_8_ = local_508._128_8_ + -4;
      xVar32 = XO_ARITHi;
      uVar38 = 7;
    }
    else {
      bVar50 = (pIVar34->field_1).t.irt;
LAB_0013dbbe:
      RVar53 = 0xffff0000;
      if ((bVar50 & 0x1f) != 0xe) {
        RVar53 = 0xbfef;
      }
      pcStack_530 = (code *)0x13dbdf;
      uVar38 = ra_dest((ASMState *)local_508,pIVar34,RVar53);
      pcStack_530 = (code *)0x13dbf2;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
      if ((pIVar34->field_1).o == 'H') {
        local_508._160_4_ = local_508._160_4_ + (uint)(pIVar34->field_0).op2 * 8;
      }
      if (((pIVar34->field_1).t.irt & 0x1f) - 0xd < 0xfffffff6) {
        xVar32 = XO_MOVSD;
        if (uVar38 < 0x10) {
          xVar32 = XO_MOV;
        }
        pcStack_530 = (code *)0x13dc3d;
        emit_mrm((ASMState *)local_508,xVar32,uVar38,0x20);
        uVar29 = 0x80;
        goto LAB_0013dc49;
      }
      *(byte *)(local_508._128_8_ + -1) = 0x11;
      bVar54 = (byte)uVar38 & 7;
      *(byte *)(local_508._128_8_ + -2) = bVar54 - 0x18;
      *(byte *)(local_508._128_8_ + -3) = 0xc1;
      uVar55 = uVar38 >> 3 & 1;
      bVar50 = (char)uVar55 + 0x48;
      *(byte *)(local_508._128_8_ + -4) = bVar50;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x13dd00;
      asm_guardcc((ASMState *)local_508,5);
      *(byte *)(local_508._128_8_ + -1) = ~(pIVar34->field_1).t.irt | 0xe0;
      *(byte *)(local_508._128_8_ + -2) = (byte)uVar38 | 0xf8;
      *(byte *)(local_508._128_8_ + -3) = 0x83;
      lVar23 = -2;
      if (uVar55 != 0) {
        *(byte *)(local_508._128_8_ + -4) = 0x41;
        lVar23 = -3;
      }
      *(byte *)(local_508._128_8_ + lVar23 + -2) = 0x66;
      *(byte *)(local_508._128_8_ + lVar23 + -3) = 0x2f;
      if ((local_450 & 0x40) != 0) {
        xVar32 = 0xf0fbe3c4;
        local_508._128_8_ = (byte *)(local_508._128_8_ + lVar23 + -3);
        break;
      }
      *(byte *)(local_508._128_8_ + lVar23 + -4) = bVar54 | 200;
      *(byte *)(local_508._128_8_ + lVar23 + -5) = 0xc1;
      *(byte *)(local_508._128_8_ + lVar23 + -6) = bVar50;
      local_508._128_8_ = local_508._128_8_ + lVar23 + -6;
LAB_0013de43:
      uVar38 = uVar38 | 0x80200;
      xVar32 = XO_MOV;
    }
    break;
  case 'E':
  case 'F':
    pcStack_530 = (code *)0x13dbac;
    asm_fxload((ASMState *)local_508,pIVar34);
    goto switchD_0013d97d_caseD_c;
  case 'G':
    uVar13 = (pIVar34->field_0).op1;
    uVar52 = (uint)uVar13 * 8 + -0x10;
    bVar50 = (byte)(pIVar34->field_0).ot;
    if (((bVar50 & 0x9f) == 0x93 & (byte)(pIVar34->field_0).op2 >> 3) == 1) {
      pcStack_530 = (code *)0x13f0da;
      RVar15 = ra_scratch((ASMState *)local_508,0xffff0000);
      pcStack_530 = (code *)0x13f0ea;
      asm_tointg((ASMState *)local_508,pIVar34,RVar15);
      RVar21 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13f112;
        RVar21 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar50 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      pcStack_530 = (code *)0x13f13d;
      emit_rmro((ASMState *)local_508,XO_MOVSD,RVar15,RVar21,uVar52);
      bVar50 = 0xe;
    }
    else if (((char)(pIVar34->field_1).r < '\0') && ((pIVar34->field_1).s == '\0')) {
      if (((pIVar34->field_0).op2 & 4) == 0) goto switchD_0013d97d_caseD_c;
      RVar21 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x140b22;
        RVar21 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar54 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar54 | 0xfffffffeU >> 0x20 - bVar54);
    }
    else {
      local_528.i = uVar52;
      bVar54 = (byte)(bVar50 & 0x1f);
      RVar53 = 0xbfef;
      if (bVar54 == 0xe) {
        RVar53 = 0xffff0000;
      }
      pcStack_530 = (code *)0x13f7da;
      RVar15 = ra_dest((ASMState *)local_508,pIVar34,RVar53);
      RVar21 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13f805;
        RVar21 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar40 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar40 | 0xfffffffeU >> 0x20 - bVar40);
      if (((pIVar34->field_0).op2 & 8) == 0) {
        if ((bVar50 & 0x1f) - 3 < 10) {
          *(byte *)(local_508._128_8_ + -1) = 0x11;
          bVar50 = (byte)RVar15 & 7;
          *(byte *)(local_508._128_8_ + -2) = bVar50 - 0x18;
          *(byte *)(local_508._128_8_ + -3) = 0xc1;
          uVar55 = RVar15 >> 3 & 1;
          uVar38 = uVar55 + 0x48;
          *(byte *)(local_508._128_8_ + -4) = (byte)uVar38;
          local_508._128_8_ = local_508._128_8_ + -4;
          if (((pIVar34->field_0).op2 & 4) != 0) {
            pcStack_530 = (code *)0x13f89c;
            local_51c = uVar38;
            asm_guardcc((ASMState *)local_508,5);
            *(byte *)(local_508._128_8_ + -1) = ~bVar54;
            *(byte *)(local_508._128_8_ + -2) = (byte)RVar15 | 0xf8;
            *(byte *)(local_508._128_8_ + -3) = 0x83;
            lVar23 = -2;
            if (uVar55 != 0) {
              *(byte *)(local_508._128_8_ + -4) = 0x41;
              lVar23 = -3;
            }
            local_508._128_8_ = local_508._128_8_ + lVar23 + -2;
            *(byte *)local_508._128_8_ = 0x66;
            uVar38 = local_51c;
          }
          if ((local_450 & 0x40) == 0) {
            bVar57 = ((pIVar34->field_0).op2 & 4) == 0;
            bVar54 = 0x2f;
            if (bVar57) {
              bVar54 = 0x11;
            }
            bVar40 = 200;
            if (bVar57) {
              bVar40 = 0xe0;
            }
            *(byte *)(local_508._128_8_ + -1) = bVar54;
            *(byte *)(local_508._128_8_ + -2) = bVar40 | bVar50;
            *(byte *)(local_508._128_8_ + -3) = 0xc1;
            *(byte *)(local_508._128_8_ + -4) = (byte)uVar38;
            RVar15 = RVar15 | 0x80200;
            xVar32 = XO_MOV;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
          }
          else {
            *(byte *)(local_508._128_8_ + -1) = 0x2f;
            xVar32 = 0xf0fbe3c4;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          }
          pcStack_530 = (code *)0x140c69;
          emit_rmro((ASMState *)local_508,xVar32,RVar15,RVar21,local_528._0_4_);
          goto switchD_0013d97d_caseD_c;
        }
        xVar32 = XO_MOV;
        if (bVar54 == 0xe) {
          xVar32 = XO_MOVSD;
        }
      }
      else {
        bVar50 = (bVar54 != 0x13) * '\x05' + 0xe;
        xVar32 = (uint)(bVar54 == 0x13) * 0x2000000 + XO_CVTSI2SD;
      }
      uVar52 = local_528._0_4_;
      pcStack_530 = (code *)0x1407f4;
      emit_rmro((ASMState *)local_508,xVar32,RVar15,RVar21,local_528._0_4_);
    }
    if (((pIVar34->field_0).op2 & 4) != 0) {
      bVar50 = bVar50 & 0x1f;
      pcStack_530 = (code *)0x14081f;
      asm_guardcc((ASMState *)local_508,(uint)(bVar50 != 0xe) * 2 + 3);
      if (bVar50 < 0xe) {
        if (bVar50 == 0) {
          *(byte *)(local_508._128_8_ + -1) = 0xff;
          xVar32 = XO_ARITHi8;
          uVar38 = 0x80207;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
        }
        else {
          if (bVar50 < 3) {
            *(uint *)(local_508._128_8_ + -4) = (int)(char)~bVar50 << 0xf | 0x7fff;
            goto LAB_00140881;
          }
          pcStack_530 = (code *)0x140b51;
          RVar15 = ra_scratch((ASMState *)local_508,~(1 << (RVar21 & 0x1f)) & 0xbfef);
          *(byte *)(local_508._128_8_ + -1) = ~bVar50;
          bVar50 = (byte)RVar15 | 0xf8;
          *(byte *)(local_508._128_8_ + -2) = bVar50;
          *(byte *)(local_508._128_8_ + -3) = 0x83;
          lVar23 = -2;
          uVar38 = RVar15 >> 3 & 1;
          if (uVar38 != 0) {
            *(byte *)(local_508._128_8_ + -4) = 0x41;
            lVar23 = -3;
          }
          *(byte *)(local_508._128_8_ + lVar23 + -2) = 0x2f;
          *(byte *)(local_508._128_8_ + lVar23 + -3) = bVar50;
          *(byte *)(local_508._128_8_ + lVar23 + -4) = 0xc1;
          *(byte *)(local_508._128_8_ + lVar23 + -5) = (byte)uVar38 | 0x48;
          uVar38 = RVar15 | 0x80200;
          xVar32 = XO_MOV;
          local_508._128_8_ = (byte *)(local_508._128_8_ + lVar23 + -5);
        }
        pcStack_530 = (code *)0x140be1;
        emit_rmro((ASMState *)local_508,xVar32,uVar38,RVar21,uVar52);
      }
      else {
        pbVar33 = (byte *)(local_508._128_8_ + -4);
        pbVar33[0] = 0;
        pbVar33[1] = 0;
        pbVar33[2] = 0xf9;
        pbVar33[3] = 0xff;
LAB_00140881:
        local_508._128_8_ = local_508._128_8_ + -4;
        pcStack_530 = (code *)0x140899;
        emit_rmro((ASMState *)local_508,XO_ARITHi,7,RVar21,(uint)uVar13 * 8 + -0xc);
      }
    }
    goto switchD_0013d97d_caseD_c;
  case 'I':
    id_00 = (uint)((pIVar34->field_0).op2 != 0x7fff) * 5 + IRCALL_lj_tab_len;
LAB_0013f64b:
    pcStack_530 = (code *)0x13f658;
    asm_callid((ASMState *)local_508,pIVar34,id_00);
    goto switchD_0013d97d_caseD_c;
  case 'J':
  case 'K':
  case 'L':
    if ((pIVar34->field_1).r == 0xfe) goto switchD_0013d97d_caseD_c;
    uVar13 = (pIVar34->field_0).op2;
    uVar29 = (ulong)uVar13;
    if (((pIVar34->field_1).t.irt & 0x1f) == 0xe) {
      cVar2 = *(char *)(local_508._144_8_ + uVar29 * 8 + 6);
      uVar38 = (uint)cVar2;
      if (cVar2 < '\0') {
        pcStack_530 = (code *)0x13d9e2;
        uVar38 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xffff0000);
      }
      bVar50 = (byte)uVar38 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      pcStack_530 = (code *)0x13da0b;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
      xVar32 = XO_MOVSDto;
    }
    else if ((short)uVar13 < 0) {
      cVar2 = *(char *)(local_508._144_8_ + uVar29 * 8 + 6);
      RVar21 = (Reg)cVar2;
      if (cVar2 < '\0') {
        pcStack_530 = (code *)0x13ff93;
        RVar21 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xbfef);
      }
      bVar50 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      pcStack_530 = (code *)0x13ffbd;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,
                     ~(1 << (RVar21 & 0x1f)) & 0xbfef);
      if (RVar21 < 0x80) {
        local_508._160_4_ = local_508._160_4_ + 4;
        *(int *)(local_508._128_8_ + -4) = (int)(char)(~(pIVar34->field_1).t.irt | 0xe0) << 0xf;
        local_508._128_8_ = local_508._128_8_ + -4;
        pcStack_530 = (code *)0x14000c;
        emit_mrm((ASMState *)local_508,XO_ARITHi,1,0x20);
        local_508._160_4_ = local_508._160_4_ - 4;
        uVar38 = RVar21 | 0x80200;
        xVar32 = XO_MOVto;
      }
      else {
        if (2 < (*(byte *)(uVar9 + uVar29 * 8 + 4) & 0x1f)) {
          *(IRRef2 *)(local_508._128_8_ + -4) = (((IRIns *)(uVar9 + uVar29 * 8))->field_1).op12;
          local_508._128_8_ = local_508._128_8_ + -4;
          pcStack_530 = (code *)0x14065b;
          emit_mrm((ASMState *)local_508,XO_MOVmi,0,0x20);
        }
        local_508._160_4_ = local_508._160_4_ + 4;
        pbVar33 = (byte *)(local_508._128_8_ + -4);
        pbVar33[0] = 0;
        pbVar33[1] = 0;
        pbVar33[2] = 0xf9;
        pbVar33[3] = 0xff;
        xVar32 = XO_MOVmi;
        uVar38 = 0;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
      }
    }
    else {
      pcStack_530 = (code *)0x13f2fe;
      lj_ir_kvalue(*(lua_State **)(local_508._152_8_ + 0x80),&local_138,
                   (IRIns *)(local_508._144_8_ + (ulong)uVar13 * 8));
      pcStack_530 = (code *)0x13f30f;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
      if (CONCAT26(local_138.u64._6_2_,CONCAT24(local_138.u64._4_2_,local_138.field_4.i)) == -1) {
        uVar38 = 0x80200;
        uVar52 = 0xffffffff;
      }
      else {
        *(int32_t *)(local_508._128_8_ + -4) = local_138.field_4.i;
        local_508._128_8_ = local_508._128_8_ + -4;
        uVar38 = 0;
        pcStack_530 = (code *)0x13f34c;
        emit_mrm((ASMState *)local_508,XO_MOVmi,0,0x20);
        local_508._160_4_ = local_508._160_4_ + 4;
        uVar52 = CONCAT22(local_138.u64._6_2_,local_138.u64._4_2_);
      }
      *(undefined4 *)(local_508._128_8_ + -4) = uVar52;
      xVar32 = XO_MOVmi;
      local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
    }
    break;
  case 'M':
  case 'N':
    pcStack_530 = (code *)0x13db9a;
    asm_fxstore((ASMState *)local_508,pIVar34);
    goto switchD_0013d97d_caseD_c;
  case 'O':
  case 'P':
    pcStack_530 = (code *)0x13db60;
    asm_snap_prep((ASMState *)local_508);
    auVar58 = pmovzxwd(extraout_XMM0_01,*pIVar34);
    local_138.u64._4_2_ = auVar58._0_2_;
    local_138.u64._6_2_ = auVar58._2_2_;
    local_130 = auVar58._4_4_;
    local_404._4_4_ = local_404._4_4_ + 1;
    pCVar35 = lj_ir_callinfo + 2;
    goto LAB_0013ef43;
  case 'Q':
    pcStack_530 = (code *)0x13e3ff;
    asm_snap_prep((ASMState *)local_508);
    local_138.field_4.i = 0x7fff;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x13e42f;
    asm_setupresult((ASMState *)local_508,pIVar34,lj_ir_callinfo + 0x20);
    pcStack_530 = (code *)0x13e43d;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x20,(IRRef *)&local_138.u64);
    bVar50 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar37 = 1 << (bVar50 & 0x1f);
    uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
    stack0xfffffffffffffba0 = uVar29;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar38 = (uint)(pIVar34->field_0).op2 << 0x18 | (uint)(pIVar34->field_0).op1;
    goto LAB_00140615;
  case 'R':
    pcStack_530 = (code *)0x13ef1f;
    asm_snap_prep((ASMState *)local_508);
    local_138.u64._4_2_ = (pIVar34->field_0).op1;
    local_138.u64._6_2_ = 0;
    local_404._4_4_ = local_404._4_4_ + 1;
    pCVar35 = lj_ir_callinfo + 0x21;
LAB_0013ef43:
    local_138.field_4.i = 0x7fff;
    pcStack_530 = (code *)0x13ef51;
    asm_setupresult((ASMState *)local_508,pIVar34,pCVar35);
    pcStack_530 = (code *)0x13ef5f;
    asm_gencall((ASMState *)local_508,pCVar35,(IRRef *)&local_138.u64);
    goto switchD_0013d97d_caseD_c;
  case 'S':
  case 'T':
    id = (((IRIns *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8))->field_1).op12;
    pcStack_530 = (code *)0x13da9d;
    CVar14 = lj_ctype_info(*(CTState **)
                            &((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x3c].val,id,
                           (CTSize *)&local_168.i);
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x13dab9;
    asm_setupresult((ASMState *)local_508,pIVar34,lj_ir_callinfo + 0x2e);
    if ((pIVar34->field_1).o == 'T') {
      uVar38 = 0x80200;
      if (local_168.field_1.op12 != 8) {
        uVar38 = 0;
      }
      uVar13 = (pIVar34->field_0).op2;
      uVar29 = (ulong)uVar13;
      bVar50 = (byte)(uVar38 >> 0x10);
      if ((short)uVar13 < 0) {
        cVar2 = *(char *)(local_508._144_8_ + uVar29 * 8 + 6);
        RVar21 = (Reg)cVar2;
        if (cVar2 < '\0') {
          pcStack_530 = (code *)0x13f9d1;
          RVar21 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xb028);
        }
        bVar54 = (byte)RVar21 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar54 | 0xfffffffeU >> 0x20 - bVar54);
        *(byte *)(local_508._128_8_ + -1) = 0x10;
        *(byte *)(local_508._128_8_ + -2) = (byte)RVar21 * '\b' & 0x38 | 0x40;
        *(byte *)(local_508._128_8_ + -3) = 0x89;
        uVar38 = (RVar21 | uVar38) >> 1 & 0x104;
        if (uVar38 == 0) {
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        else {
          *(byte *)(local_508._128_8_ + -4) = (byte)uVar38 | bVar50 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -4;
        }
      }
      else {
        uVar55 = (uint)*(byte *)(local_508._144_8_ + uVar29 * 8 + 5);
        if ((uVar55 < 0x1e) && ((0x26000000U >> (uVar55 & 0x1f) & 1) != 0)) {
          u64 = *(IRIns *)(local_508._144_8_ + (uVar29 + 1) * 8);
        }
        else {
          u64.gcr.gcptr64._4_4_ = 0;
          u64.field_1.op12 = (((IRIns *)(local_508._144_8_ + uVar29 * 8))->field_1).op12;
        }
        if ((local_168.field_1.op12 == 4) || ((long)u64 + 0x80000000U >> 0x20 == 0)) {
          *(int32_t *)(local_508._128_8_ + -4) = u64.i;
          *(byte *)(local_508._128_8_ + -5) = 0x10;
          ((byte *)(local_508._128_8_ + -7))[0] = 199;
          ((byte *)(local_508._128_8_ + -7))[1] = 0x40;
          if ((uVar38 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -7;
          }
          else {
            *(byte *)(local_508._128_8_ + -8) = bVar50 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -8;
          }
        }
        else {
          *(byte *)(local_508._128_8_ + -1) = 0x10;
          ((byte *)(local_508._128_8_ + -3))[0] = 0x89;
          ((byte *)(local_508._128_8_ + -3))[1] = 0x48;
          if ((uVar38 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -3;
          }
          else {
            *(byte *)(local_508._128_8_ + -4) = bVar50 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -4;
          }
          pcStack_530 = (code *)0x140463;
          emit_loadu64((ASMState *)local_508,1,(uint64_t)u64);
        }
      }
    }
    else if ((pIVar34->field_0).op2 != 0x7fff) {
      local_138.field_4.i = 0x7fff;
      local_138.u64._4_2_ = (pIVar34->field_0).op1;
      local_138.u64._6_2_ = 0;
      local_12c = 0x7ffd;
      pcStack_530 = (code *)0x13de8f;
      local_130 = (uint)(pIVar34->field_0).op2;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x6a,(IRRef *)&local_138.u64);
      bVar50 = *(byte *)(local_508._144_8_ + 0x3ffee);
      iVar37 = 1 << (bVar50 & 0x1f);
      uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar29;
      stack0xfffffffffffffba0 = uVar29;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      pcStack_530 = (code *)0x13dedd;
      emit_loadi((ASMState *)local_508,(uint)bVar50,CVar14 >> 0x10 & 0xf);
      goto switchD_0013d97d_caseD_c;
    }
    *(byte *)(local_508._128_8_ + -1) = 8;
    ((byte *)(local_508._128_8_ + -3))[0] = 0x89;
    ((byte *)(local_508._128_8_ + -3))[1] = 0x48;
    *(CTypeID *)(local_508._128_8_ + -7) = id << 0x10 | 0xa00;
    *(byte *)(local_508._128_8_ + -8) = 0xc9;
    pbVar33 = (byte *)(local_508._128_8_ + -0xc);
    pbVar33[0] = 0x83;
    pbVar33[1] = 0xe1;
    pbVar33[2] = 3;
    pbVar33[3] = 0x81;
    local_508._128_8_ = local_508._128_8_ + -0xc;
    pcStack_530 = (code *)0x1405ae;
    emit_rma((ASMState *)local_508,XO_MOVZXb,1,
             &((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x26].val);
    local_138.field_4.i = 0x7fff;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x1405d2;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x2e,(IRRef *)&local_138.u64);
    bVar50 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar37 = 1 << (bVar50 & 0x1f);
    uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
    stack0xfffffffffffffba0 = uVar29;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar38 = local_168.field_1.op12 + 0x10;
LAB_00140615:
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar29;
    pcStack_530 = (code *)0x14061c;
    emit_loadi((ASMState *)local_508,(uint)bVar50,uVar38);
    goto switchD_0013d97d_caseD_c;
  case 'U':
    pcStack_530 = (code *)0x13e066;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    IVar41 = (pIVar34->field_0).op2;
    if (IVar41 == 2) {
      pcStack_530 = (code *)0x1400c9;
      RVar15 = ra_scratch((ASMState *)local_508,~(1 << (RVar21 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x1400ec;
      emit_storeofs((ASMState *)local_508,(IRIns *)&local_138,RVar15,RVar21,0x18);
      pcStack_530 = (code *)0x140110;
      emit_rma((ASMState *)local_508,XO_OR,RVar15 | 0x80200,
               &((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x3b].val);
      *(byte *)(local_508._128_8_ + -1) = 7;
      *(byte *)(local_508._128_8_ + -2) = (byte)RVar15 & 7 | 0xe0;
      *(byte *)(local_508._128_8_ + -3) = 0x83;
      if ((RVar15 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -3;
      }
      else {
        *(byte *)(local_508._128_8_ + -4) = 0x41;
        local_508._128_8_ = local_508._128_8_ + -4;
      }
      iVar46 = 0x18;
LAB_001406c1:
      pcStack_530 = (code *)0x1406c6;
      emit_loadofs((ASMState *)local_508,(IRIns *)&local_138,RVar15,RVar21,iVar46);
    }
    else if (IVar41 == 1) {
      uVar13 = (pIVar34->field_0).op1;
      if (((*(char *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6) < '\0') &&
          (pIVar18 = (IRIns *)(local_508._144_8_ + (ulong)uVar13 * 8), pIVar18 != pIVar34 + -1)) &&
         ((pIVar18 != pIVar34 + -2 ||
          ((-1 < *(char *)((long)pIVar34 + -2) || (*(char *)((long)pIVar34 + -1) != '\0')))))) {
        for (; ((pIVar18->field_1).o != 'U' || ((pIVar18->field_0).op2 != 0));
            pIVar18 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar18->field_0).op1 * 8)) {
        }
        if (-1 < (short)(pIVar18->field_0).op1) {
          pcStack_530 = (code *)0x14009d;
          RVar15 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xbfef);
          uStack_458 = uStack_458 | 1 << ((byte)RVar15 & 0x1f);
          pIVar34 = pIVar18;
        }
      }
    }
    else if (IVar41 == 0) {
      pcStack_530 = (code *)0x13e09b;
      RVar15 = ra_scratch((ASMState *)local_508,~(1 << (RVar21 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x13e0c0;
      emit_storeofs((ASMState *)local_508,(IRIns *)&local_138,RVar15,RVar21,0);
      iVar46 = 0x10;
      goto LAB_001406c1;
    }
    pcStack_530 = (code *)0x1406d6;
    ra_left((ASMState *)local_508,RVar21,(uint)(pIVar34->field_0).op1);
    goto switchD_0013d97d_caseD_c;
  case 'V':
    local_138.field_4.i = (int32_t)(pIVar34->field_0).op1;
    local_138.u64._4_2_ = (pIVar34->field_0).op2;
    uVar29 = (ulong)(ushort)local_138.u64._4_2_;
    cVar2 = *(char *)(local_508._144_8_ + uVar29 * 8 + 5);
    pCVar35 = lj_ir_callinfo + 0x11;
    local_528 = (int32_t)local_508._144_8_;
    if (cVar2 == '\x18') {
      iVar37 = -0x81;
      if (*(int *)((long)*(IRIns *)(local_508._144_8_ + (uVar29 + 1) * 8) + 0x14) == 1) {
        iVar37 = (int)*(char *)((long)*(IRIns *)(local_508._144_8_ + (uVar29 + 1) * 8) + 0x18);
        pCVar35 = lj_ir_callinfo + 0x12;
LAB_0013e297:
        local_138.u64._4_2_ = 0x7ffd;
      }
    }
    else {
      iVar37 = -0x81;
      if ((local_410 < (ushort)local_138.u64._4_2_) &&
         (*(char *)(local_508._144_8_ + uVar29 * 8 + 6) < '\0')) {
        if (cVar2 == 'O') {
          local_138.u64._4_2_ = (((IRIns *)(local_508._144_8_ + uVar29 * 8))->field_0).op1;
          local_130 = (uint32_t)*(ushort *)(local_508._144_8_ + uVar29 * 8 + 2);
          pCVar35 = lj_ir_callinfo + 0x10;
        }
        else if (cVar2 == ']') {
          sVar4 = *(short *)(local_508._144_8_ + uVar29 * 8 + 2);
          if (sVar4 == 1) {
            pCVar35 = lj_ir_callinfo + 8;
            goto LAB_0013e297;
          }
          local_138.u64._4_2_ = (((IRIns *)(local_508._144_8_ + uVar29 * 8))->field_0).op1;
          pCVar35 = lj_ir_callinfo + 0x12;
          if (sVar4 == 0) {
            pCVar35 = lj_ir_callinfo + 7;
          }
        }
      }
    }
    uVar12 = local_138.u64._4_2_;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13f416;
    asm_setupresult((ASMState *)local_508,pIVar34,pCVar35);
    pcStack_530 = (code *)0x13f429;
    asm_gencall((ASMState *)local_508,pCVar35,(IRRef *)&local_138.u64);
    if (uVar12 == 0x7ffd) {
      RVar21 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar27 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      uVar36 = CONCAT44(iVar27,iVar27) | stack0xfffffffffffffba0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar36;
      stack0xfffffffffffffba0 = uVar36;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      if (iVar37 == -0x81) {
        IVar28 = (IRRef)*(ushort *)((long)local_528 + uVar29 * 8);
        goto LAB_0013f6f5;
      }
      pcStack_530 = (code *)0x14014d;
      emit_loadi((ASMState *)local_508,RVar21,iVar37);
    }
    goto switchD_0013d97d_caseD_c;
  case 'W':
    local_138.field_4.i = (int32_t)(pIVar34->field_0).op1;
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x13e2d0;
    asm_setupresult((ASMState *)local_508,pIVar34,lj_ir_callinfo + 0x1e);
    pCVar35 = lj_ir_callinfo + 0x1e;
LAB_0013ede8:
    pcStack_530 = (code *)0x13edf0;
    asm_gencall((ASMState *)local_508,pCVar35,(IRRef *)&local_138.u64);
    goto switchD_0013d97d_caseD_c;
  case 'X':
    uVar38 = (uint)*(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
    if ((int)uVar38 < 0) {
      pcStack_530 = (code *)0x13ef9e;
      uVar38 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xbfef);
    }
    bVar50 = (byte)uVar38 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
    pcStack_530 = (code *)0x13efc5;
    RVar21 = ra_scratch((ASMState *)local_508,~(1 << (uVar38 & 0x1f)) & 0xbfef);
    uVar9 = local_508._128_8_;
    pcStack_530 = (code *)0x13efee;
    emit_rmro((ASMState *)local_508,XO_MOVto,RVar21 | 0x80200,uVar38,0x18);
    pcStack_530 = (code *)0x13f012;
    emit_rma((ASMState *)local_508,XO_MOVto,uVar38 | 0x80200,
             &((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x28].val);
    pcStack_530 = (code *)0x13f02b;
    emit_rma((ASMState *)local_508,XO_MOV,RVar21 | 0x80200,
             &((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x28].val);
    *(byte *)(local_508._128_8_ + -1) = 0xfb;
    pcStack_530 = (code *)0x13f05b;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
    emit_rmro((ASMState *)local_508,XO_ARITHib,4,uVar38,8);
    *(char *)(local_508._128_8_ + -1) = (char)uVar9 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    pcStack_530 = (code *)0x13f093;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    emit_rmro((ASMState *)local_508,XO_GROUP3b,0,uVar38,8);
    goto switchD_0013d97d_caseD_c;
  case 'Y':
    pcStack_530 = (code *)0x13def4;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    uVar9 = local_508._128_8_;
    local_138.field_4.i = 0x7ffd;
    local_138.u64._4_2_ = (pIVar34->field_0).op1;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13df1f;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x2d,(IRRef *)&local_138.u64);
    bVar50 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar37 = 1 << (bVar50 & 0x1f);
    uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar29;
    stack0xfffffffffffffba0 = uVar29;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x13df72;
    emit_loadu64((ASMState *)local_508,(uint)bVar50,
                 (uint64_t)&((jit_State *)(local_508._152_8_ + -0xc48))->penalty[0x24].val);
    bVar50 = *(byte *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6);
    *(char *)(local_508._128_8_ + -1) = (char)uVar9 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    pbVar33 = (byte *)(local_508._128_8_ + -3);
    *(byte *)(local_508._128_8_ + -3) = 3;
    uVar13 = (pIVar34->field_0).op2;
    local_508._128_8_ = pbVar33;
    if ((short)uVar13 < 0) {
      cVar2 = *(char *)(local_508._144_8_ + (ulong)uVar13 * 8 + 6);
      RVar21 = (Reg)cVar2;
      if (cVar2 < '\0') {
        pcStack_530 = (code *)0x13fa45;
        RVar21 = ra_allocref((ASMState *)local_508,(uint)uVar13,~(1 << (bVar50 & 0x1f)) & 0xfc7);
      }
      bVar54 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar54 | 0xfffffffeU >> 0x20 - bVar54);
      pcStack_530 = (code *)0x13fa6b;
      emit_rmro((ASMState *)local_508,XO_GROUP3b,0,RVar21,8);
    }
    else {
      pcStack_530 = (code *)0x13dfd2;
      emit_rma((ASMState *)local_508,XO_GROUP3b,0,
               (void *)((long)*(IRIns *)(local_508._144_8_ + ((ulong)uVar13 + 1) * 8) + 8));
    }
    *(char *)(local_508._128_8_ + -1) = (char)uVar9 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    pcStack_530 = (code *)0x13faa5;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    emit_rmro((ASMState *)local_508,XO_GROUP3b,0,(uint)bVar50,-8);
    goto switchD_0013d97d_caseD_c;
  case '[':
    uVar55 = (pIVar34->field_0).op2 & 0x1f;
    uVar5 = (ushort)uVar55;
    bVar57 = (ushort)(uVar5 - 0x15) < 2;
    uVar13 = (pIVar34->field_0).op1;
    IVar39.gcr.gcptr64._2_6_ = 0;
    IVar39.field_0.op1 = uVar13;
    bVar50 = (byte)(pIVar34->field_0).ot;
    uVar38 = bVar50 & 0x1f;
    if ((byte)((char)uVar38 - 0xdU) < 2) {
      pcStack_530 = (code *)0x13eebc;
      local_528 = IVar39;
      RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xffff0000);
      IVar28 = local_528.field_1.op12;
      if ((ushort)(uVar5 - 0xd) < 2) {
        pcStack_530 = (code *)0x13eeea;
        RVar15 = asm_fuseload((ASMState *)local_508,IVar28,0xffff0000);
        pcStack_530 = (code *)0x13ef04;
        emit_mrm((ASMState *)local_508,(uint)(uVar5 != 0xe) << 8 | XO_CVTSD2SS,RVar21,RVar15);
        if (RVar15 == RVar21) goto switchD_0013d97d_caseD_c;
      }
      else {
        uVar38 = (uint)(uVar55 == 9 || bVar57);
        if ((uVar55 | 2) == 0x16) {
          cVar2 = *(char *)(local_508._144_8_ + ((ulong)local_528 & 0xffffffff) * 8 + 6);
          RVar15 = (Reg)cVar2;
          if (cVar2 < '\0') {
            pcStack_530 = (code *)0x14020d;
            RVar15 = ra_allocref((ASMState *)local_508,IVar28,0xbfef);
          }
          bVar50 = (byte)RVar15 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
        }
        else {
          pcStack_530 = (code *)0x1409bd;
          RVar15 = asm_fuseloadm((ASMState *)local_508,IVar28,0xbfef,uVar38);
        }
        uVar9 = local_508._128_8_;
        if (uVar5 == 0x16) {
          pcStack_530 = (code *)0x1409eb;
          emit_rma((ASMState *)local_508,XO_ADDSD,RVar21,(TValue *)(local_508._152_8_ + 0x130) + 1);
          *(char *)(local_508._128_8_ + -1) = (char)uVar9 - (char)local_508._128_8_;
          *(byte *)(local_508._128_8_ + -2) = 0x79;
          *(byte *)(local_508._128_8_ + -3) = ((byte)RVar15 & 7) + (byte)RVar15 * '\b' | 0xc0;
          *(byte *)(local_508._128_8_ + -4) = 0x85;
          *(byte *)(local_508._128_8_ + -5) =
               (byte)(RVar15 >> 0x10) | (byte)(RVar15 >> 1) & 4 | (byte)(RVar15 >> 3) & 1 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -5;
        }
        if (uVar55 == 9 || bVar57) {
          uVar38 = 0x80200;
        }
        if (uVar5 == 0x14) {
          uVar38 = 0x80200;
        }
        pcStack_530 = (code *)0x140a82;
        emit_mrm((ASMState *)local_508,
                 (uint)(((pIVar34->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,uVar38 | RVar21
                 ,RVar15);
      }
      *(byte *)(local_508._128_8_ + -1) = ((byte)RVar21 & 7) + (byte)RVar21 * '\b' | 0xc0;
      ((byte *)(local_508._128_8_ + -3))[0] = 0xf;
      ((byte *)(local_508._128_8_ + -3))[1] = 0x57;
      uVar38 = RVar21 >> 3 & 1 | RVar21 >> 1 & 4;
      if (uVar38 == 0) {
        local_508._128_8_ = local_508._128_8_ + -3;
      }
      else {
        *(byte *)(local_508._128_8_ + -4) = (byte)uVar38 | 0x40;
        local_508._128_8_ = local_508._128_8_ + -4;
      }
LAB_00140fdf:
      goto switchD_0013d97d_caseD_c;
    }
    if ((ushort)(uVar5 - 0xd) < 2) {
      if ((char)bVar50 < '\0') {
        cVar2 = *(char *)(local_508._144_8_ + (long)IVar39 * 8 + 6);
        RVar21 = (Reg)cVar2;
        if (cVar2 < '\0') {
          pcStack_530 = (code *)0x1408f7;
          RVar21 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xffff0000);
        }
        bVar50 = (byte)RVar21 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
        pcStack_530 = (code *)0x140915;
        asm_tointg((ASMState *)local_508,pIVar34,RVar21);
        goto switchD_0013d97d_caseD_c;
      }
      pcStack_530 = (code *)0x13f747;
      RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
      xVar32 = (uint)(uVar5 != 0xe) << 8 | XO_CVTTSD2SI;
      uVar38 = (pIVar34->field_1).t.irt & 0x1f;
      bVar50 = (byte)RVar21;
      if (uVar38 == 0x14) {
        *(byte *)(local_508._128_8_ + -1) = (bVar50 & 7) + bVar50 * '\b' | 0xc0;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        uVar38 = RVar21 >> 3 & 1 | RVar21 >> 1 & 4;
        if (uVar38 == 0) {
          local_508._128_8_ = local_508._128_8_ + -2;
        }
        else {
          *(byte *)(local_508._128_8_ + -3) = (byte)uVar38 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        uVar38 = (uint)((pIVar34->field_1).t.irt & 0x1f);
      }
      else if (uVar38 == 0x16) {
        if (*(char *)(local_508._144_8_ + (long)IVar39 * 8 + 6) < '\0') {
          pcStack_530 = (code *)0x141112;
          local_528 = IVar39;
          RVar15 = ra_allocref((ASMState *)local_508,(uint)uVar13,0xffff0000);
          bVar54 = (byte)RVar15 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar54 | 0xfffffffeU >> 0x20 - bVar54);
        }
        else {
          pcStack_530 = (code *)0x13f795;
          local_528 = IVar39;
          RVar15 = ra_scratch((ASMState *)local_508,0xffff0000);
        }
        uVar9 = local_508._128_8_;
        pcStack_530 = (code *)0x141148;
        emit_rr((ASMState *)local_508,xVar32,RVar21 | 0x80200,RVar15);
        lVar23 = 0x104;
        if (uVar5 == 0xe) {
          lVar23 = 0x140;
        }
        pcStack_530 = (code *)0x141182;
        emit_rma((ASMState *)local_508,(uint)(uVar5 != 0xe) << 8 | XO_ADDSD,RVar15,
                 (void *)((long)&(((GCtrace *)local_508._152_8_)->nextgc).gcptr64 + lVar23));
        *(char *)(local_508._128_8_ + -1) = (char)uVar9 - (char)local_508._128_8_;
        *(byte *)(local_508._128_8_ + -2) = 0x79;
        *(byte *)(local_508._128_8_ + -3) = (bVar50 & 7) + bVar50 * '\b' | 0xc0;
        *(byte *)(local_508._128_8_ + -4) = 0x85;
        *(byte *)(local_508._128_8_ + -5) = (byte)(RVar21 >> 3) & 1 | (byte)(RVar21 >> 1) & 4 | 0x48
        ;
        local_508._128_8_ = local_508._128_8_ + -5;
        pcStack_530 = (code *)0x1411df;
        emit_rr((ASMState *)local_508,xVar32,RVar21 | 0x80200,RVar15);
        pcStack_530 = (code *)0x1411ee;
        ra_left((ASMState *)local_508,RVar15,local_528.i);
        goto switchD_0013d97d_caseD_c;
      }
      uVar55 = 0;
      if ((char)uVar38 == '\x14') {
        uVar55 = 0x80200;
      }
      if ((0x605fd9U >> uVar38 & 1) != 0) {
        uVar55 = 0x80200;
      }
      RVar21 = uVar55 | RVar21;
      pcStack_530 = (code *)0x141236;
      RVar15 = asm_fuseload((ASMState *)local_508,(uint)uVar13,0xffff0000);
    }
    else if ((ushort)(uVar5 - 0xf) < 4) {
      pcStack_530 = (code *)0x14024d;
      RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
      if (uVar5 == 0x11) {
        xVar32 = XO_MOVSXw;
      }
      else if (uVar55 == 0x10) {
        RVar21 = RVar21 | 0x200;
        xVar32 = XO_MOVZXb;
      }
      else if (uVar55 == 0xf) {
        RVar21 = RVar21 | 0x200;
        xVar32 = XO_MOVSXb;
      }
      else {
        xVar32 = XO_MOVZXw;
      }
      pcStack_530 = (code *)0x14103f;
      RVar15 = asm_fuseload((ASMState *)local_508,(uint)uVar13,0xbfef);
    }
    else {
      pcStack_530 = (code *)0x140775;
      RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
      if ((0x605fd9U >> uVar38 & 1) == 0) {
        if (((uVar5 < 0x17) && ((0x600200U >> uVar55 & 1) != 0)) &&
           (((pIVar34->field_0).op2 & 0x1000) == 0)) {
          pcStack_530 = (code *)0x1407bf;
          RVar15 = asm_fuseload((ASMState *)local_508,(uint)uVar13,0xbfef);
          xVar32 = XO_MOV;
          goto LAB_0013ed82;
        }
LAB_00140c00:
        pcStack_530 = (code *)0x140c10;
        ra_left((ASMState *)local_508,RVar21,(uint)uVar13);
        goto switchD_0013d97d_caseD_c;
      }
      if (((uVar5 < 0x17) && ((0x600200U >> uVar55 & 1) != 0)) ||
         (((pIVar34->field_0).op2 & 0x800) == 0)) goto LAB_00140c00;
      pcStack_530 = (code *)0x141287;
      RVar15 = asm_fuseload((ASMState *)local_508,(uint)uVar13,0xbfef);
      RVar21 = RVar21 | 0x80200;
      xVar32 = XO_MOVSXd;
    }
LAB_0013ed82:
    pcStack_530 = (code *)0x13ed89;
    emit_mrm((ASMState *)local_508,xVar32,RVar21,RVar15);
    goto switchD_0013d97d_caseD_c;
  case '\\':
    pcStack_530 = (code *)0x13e3ba;
    RVar21 = ra_dest((ASMState *)local_508,pIVar34,0xbfef);
    if (*(char *)(local_508._144_8_ + (ulong)(pIVar34->field_0).op1 * 8 + 6) < '\0') {
      pcStack_530 = (code *)0x13fb2e;
      uVar38 = ra_allocref((ASMState *)local_508,(uint)(pIVar34->field_0).op1,0xffff0000);
      bVar50 = (byte)uVar38;
      uStack_458 = uStack_458 & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
    }
    else {
      pcStack_530 = (code *)0x13e3e2;
      uVar38 = ra_scratch((ASMState *)local_508,0xffff0000);
      bVar50 = (byte)uVar38;
    }
    *(byte *)(local_508._128_8_ + -1) = ((byte)RVar21 & 7) + (char)uVar38 * '\b' | 0xc0;
    pbVar33 = (byte *)(local_508._128_8_ + -5);
    pbVar33[0] = 0xfc;
    pbVar33[1] = 0x66;
    pbVar33[2] = 0xf;
    pbVar33[3] = 0x7e;
    uVar55 = RVar21 >> 3 & 1 | uVar38 >> 1 & 4;
    pbVar33 = (byte *)(local_508._128_8_ + -4);
    if (uVar55 != 0) {
      pbVar33 = (byte *)(local_508._128_8_ + -5);
      *(byte *)(local_508._128_8_ + -4) = (byte)uVar55 | 0x40;
      *pbVar33 = 0x66;
    }
    pcStack_530 = (code *)0x13fbae;
    local_508._128_8_ = pbVar33;
    RVar21 = asm_fuseload((ASMState *)local_508,(uint)(pIVar34->field_0).op2,
                          ~(1 << (bVar50 & 0x1f)) & 0xffff0000);
    pcStack_530 = (code *)0x13fbbf;
    emit_mrm((ASMState *)local_508,XO_ADDSD,uVar38,RVar21);
    pcStack_530 = (code *)0x13fbcd;
    ra_left((ASMState *)local_508,uVar38,(uint)(pIVar34->field_0).op1);
    goto switchD_0013d97d_caseD_c;
  case ']':
    pcStack_530 = (code *)0x13ee02;
    asm_snap_prep((ASMState *)local_508);
    local_404._4_4_ = local_404._4_4_ + 1;
    local_138.field_4.i = 0x7fff;
    if ((pIVar34->field_0).op2 == 1) {
      pCVar35 = lj_ir_callinfo + 5;
      local_138.u64._4_2_ = 0x7ffd;
    }
    else {
      local_138.u64._4_2_ = (pIVar34->field_0).op1;
      pCVar35 = lj_ir_callinfo + (ulong)((pIVar34->field_0).op2 != 0) * 2 + 4;
    }
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13f69a;
    asm_setupresult((ASMState *)local_508,pIVar34,pCVar35);
    pcStack_530 = (code *)0x13f6a8;
    asm_gencall((ASMState *)local_508,pCVar35,(IRRef *)&local_138.u64);
    if ((pIVar34->field_0).op2 == 1) {
      RVar21 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar37 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar29;
      stack0xfffffffffffffba0 = uVar29;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar28 = (IRRef)(pIVar34->field_0).op1;
LAB_0013f6f5:
      pcStack_530 = (code *)0x13f701;
      asm_tvptr((ASMState *)local_508,RVar21,IVar28,1);
    }
    goto switchD_0013d97d_caseD_c;
  case '^':
    pcStack_530 = (code *)0x13f157;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    pcStack_530 = (code *)0x13f164;
    asm_guardcc((ASMState *)local_508,4);
    ((byte *)(local_508._128_8_ + -2))[0] = 0x85;
    ((byte *)(local_508._128_8_ + -2))[1] = 0xc0;
    local_508._128_8_ = local_508._128_8_ + -2;
    local_138.field_4.i = (int32_t)(pIVar34->field_0).op1;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x13f1a0;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 3,(IRRef *)&local_138.u64);
    bVar50 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar37 = 1 << (bVar50 & 0x1f);
    uVar29 = CONCAT44(iVar37,iVar37) | stack0xfffffffffffffba0;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar29;
    stack0xfffffffffffffba0 = uVar29;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x13f1fc;
    emit_rmro((ASMState *)local_508,XO_LEA,bVar50 | 0x80200,4,(uint)(pIVar34->field_1).s << 2);
    goto switchD_0013d97d_caseD_c;
  case '_':
  case 'a':
  case 'b':
    goto switchD_0013d97d_caseD_5f;
  case '`':
    local_404._4_4_ = local_404._4_4_ + 1;
switchD_0013d97d_caseD_5f:
    uVar13 = (pIVar34->field_0).op2;
    pcStack_530 = (code *)0x13ece8;
    asm_collectargs((ASMState *)local_508,pIVar34,(CCallInfo *)(ulong)lj_ir_callinfo[uVar13].flags,
                    (IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x13ecf6;
    asm_setupresult((ASMState *)local_508,pIVar34,lj_ir_callinfo + uVar13);
    pcStack_530 = (code *)0x13ed04;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + uVar13,(IRRef *)&local_138.u64);
    goto switchD_0013d97d_caseD_c;
  case 'c':
    pcStack_530 = (code *)0x13dfe7;
    local_160 = asm_callx_flags((ASMState *)local_508,pIVar34);
    pcStack_530 = (code *)0x13e008;
    asm_collectargs((ASMState *)local_508,pIVar34,(CCallInfo *)(ulong)local_160,
                    (IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x13e016;
    asm_setupresult((ASMState *)local_508,pIVar34,(CCallInfo *)&local_168.field_0);
    uVar29 = (ulong)(pIVar34->field_0).op2;
    pIVar34 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
    if ((pIVar34->field_1).o == 'd') {
      uVar29 = (ulong)(pIVar34->field_0).op1;
      pIVar34 = (IRIns *)(local_508._144_8_ + uVar29 * 8);
    }
    if ((short)uVar29 < 0) {
LAB_0013fe4f:
      local_168 = (IRIns)0x0;
LAB_0013fe5b:
      cVar2 = *(char *)(local_508._144_8_ + uVar29 * 8 + 6);
      RVar21 = (Reg)cVar2;
      if (cVar2 < '\0') {
        pcStack_530 = (code *)0x13fe78;
        RVar21 = ra_allocref((ASMState *)local_508,(IRRef)uVar29,0xb028);
      }
      bVar50 = (byte)RVar21 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      *(byte *)(local_508._128_8_ + -1) = (byte)RVar21 & 7 | 0xd0;
      *(byte *)(local_508._128_8_ + -2) = 0xff;
      if ((RVar21 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -2;
      }
      else {
        *(byte *)(local_508._128_8_ + -3) = 0x41;
        local_508._128_8_ = local_508._128_8_ + -3;
      }
    }
    else {
      if ((pIVar34->field_1).o == '\x1d') {
        local_168 = pIVar34[1];
      }
      else {
        local_168.gcr.gcptr64._4_4_ = 0;
        local_168.field_1.op12 = (pIVar34->field_1).op12;
      }
      if ((long)(int)((long)local_168 - local_508._128_8_) != (long)local_168 - local_508._128_8_)
      goto LAB_0013fe4f;
      if (local_168 == (IRIns)0x0) goto LAB_0013fe5b;
    }
    pcStack_530 = (code *)0x13fed4;
    asm_gencall((ASMState *)local_508,(CCallInfo *)&local_168.field_0,(IRRef *)&local_138.u64);
    goto switchD_0013d97d_caseD_c;
  }
  pcStack_530 = (code *)0x1403c8;
  emit_mrm((ASMState *)local_508,xVar32,uVar38,0x20);
  goto switchD_0013d97d_caseD_c;
LAB_0014136e:
  auVar59 = pmovsxbw(auVar59,0xff00ff00ff00ff00);
  if ((local_3b8 != (byte *)0x0) &&
     (pGVar17 = local_150->curfinal, J = local_150, local_148->nins <= pGVar17->nins))
  goto LAB_0013ccb3;
  if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) {
LAB_00141ded:
    pcStack_530 = (code *)0x141df7;
    asm_mclimit((ASMState *)local_508);
  }
  if (0 < local_404._4_4_) {
    local_440 = (IRRef)local_3f8->snap->ref;
    pcStack_530 = (code *)0x1413e8;
    asm_snap_prep((ASMState *)local_508);
    pcStack_530 = (code *)0x1413f0;
    asm_gc_check((ASMState *)local_508);
    local_440 = local_43c;
  }
  if ((uint)local_508._168_4_ < 0xffff0000) {
    uVar38 = ~local_508._168_4_ & 0xffff0000;
    do {
      uVar55 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      if (*(ushort *)(local_508 + (ulong)uVar55 * 4) < 0x8000) {
        pcStack_530 = (code *)0x14142f;
        ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar55 * 4));
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
      }
      bVar50 = (byte)uVar55 & 0x1f;
      uVar38 = uVar38 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
    } while (uVar38 != 0);
  }
  if ((local_508._168_4_ & 0xbfef) != 0xbfef) {
    uVar38 = local_508._168_4_ & 0xbfef ^ 0xbfef;
    do {
      uVar55 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      if (*(ushort *)(local_508 + (ulong)uVar55 * 4) < 0x8000) {
        pcStack_530 = (code *)0x141484;
        ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar55 * 4));
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
      }
      bVar50 = (byte)uVar55 & 0x1f;
      uVar38 = uVar38 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
    } while (uVar38 != 0);
  }
  auVar58 = stack0xfffffffffffffba0;
  if (local_3f0 == (GCtrace *)0x0) {
    bVar50 = *(byte *)(local_508._144_8_ + 0x40006);
    if (-1 < (char)bVar50) {
      local_508._168_4_ = local_508._168_4_ | 1 << (bVar50 & 0x1f);
      auVar10 = stack0xfffffffffffffba0;
      RStack_45c = auVar58._4_4_;
      if (((RStack_45c >> ((int)(char)bVar50 & 0x1fU) & 1) != 0) ||
         ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
      }
      unique0x100049b5 = auVar10;
      if (bVar50 != 2) {
        *(byte *)(local_508._128_8_ + -1) = bVar50 * '\b' | 0xc2;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        *(byte *)(local_508._128_8_ + -3) = bVar50 >> 1 & 4 | 0x48;
        local_508._128_8_ = local_508._128_8_ + -3;
      }
    }
    *(uint *)(local_508._128_8_ + -4) = (uint)local_3f8->traceno;
    local_508._128_8_ = local_508._128_8_ + -4;
    pcStack_530 = (code *)0x14166b;
    emit_rma((ASMState *)local_508,XO_MOVmi,0,
             ((jit_State *)(local_508._152_8_ + -0xc48))->penalty + 0x30);
    uVar38 = local_448 * 4 + 4 & 0xfffffff0;
    if ((int)local_448 < 3) {
      uVar38 = 0;
    }
    local_3f8->spadjust = (uint16_t)uVar38;
    if (uVar38 != 0) {
      if (uVar38 + 0x7f < 0x100) {
        *(byte *)(local_508._128_8_ + -1) = (byte)-uVar38;
        local_508._128_8_ = local_508._128_8_ + -1;
        uVar52 = 0x830000fe;
      }
      else {
        *(uint *)(local_508._128_8_ + -4) = -uVar38;
        local_508._128_8_ = local_508._128_8_ + -4;
        uVar52 = 0x810000fe;
      }
      *(byte *)(local_508._128_8_ + -1) = 0xc4;
      *(undefined4 *)(local_508._128_8_ + -5) = uVar52;
      *(byte *)(local_508._128_8_ + -3) = 0x48;
      local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    }
    local_3f8->topslot = *(uint8_t *)((local_3f8->startpt).gcptr64 + 0xb);
LAB_00141cee:
    J = local_150;
    pGVar17 = local_148;
    for (uVar38 = uStack_454; local_150 = J, local_148 = pGVar17, uVar38 != 0;
        uVar38 = uVar38 & (-2 << bVar54 | 0xfffffffeU >> 0x20 - bVar54)) {
      uVar42 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8 | uVar38 << 0x18;
      uVar55 = 0x1f;
      if (uVar42 != 0) {
        for (; uVar42 >> uVar55 == 0; uVar55 = uVar55 - 1) {
        }
      }
      uVar13 = *(ushort *)(local_3b0 + (ulong)(uVar55 ^ 0x18) * 2);
      uVar29 = (ulong)uVar13;
      bVar50 = *(byte *)(local_508._144_8_ + uVar29 * 8 + 4);
      bVar54 = (byte)(uVar55 ^ 0x18);
      if (((bVar50 & 0x20) != 0) &&
         (*(byte *)(local_508._144_8_ + uVar29 * 8 + 4) = bVar50 & 0xdf,
         *(char *)(local_508._144_8_ + uVar29 * 8 + 7) != '\0')) {
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.ot = 0x1400;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op1 = uVar13;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op2 = (IRRef1)local_428;
        pcStack_530 = (code *)0x141d5a;
        TVar16 = lj_ir_emit((jit_State *)local_508._152_8_);
        uVar29 = (ulong)((TVar16 & 0xffff) << 3);
        *(byte *)((long)((GCtrace *)local_508._152_8_)->ir + uVar29 + 6) = bVar54;
        *(undefined1 *)((long)((GCtrace *)local_508._152_8_)->ir + uVar29 + 7) = 0;
      }
      bVar54 = bVar54 & 0x1f;
      J = local_150;
      pGVar17 = local_148;
    }
    T_00 = J->curfinal;
    if (pGVar17->nins <= T_00->nins) {
      pcStack_530 = (code *)0x141e1f;
      memcpy(T_00->ir + local_438,pGVar17->ir + local_438,(ulong)(pGVar17->nins - local_438) << 3);
      pGVar17->nins = J->curfinal->nins;
      local_440 = 0x8001;
      pcStack_530 = (code *)0x141e3c;
      asm_snap_prev((ASMState *)local_508);
      if (local_508._168_4_ == 0xffffbfef) {
        pGVar17->mcode = (MCode *)local_508._128_8_;
        MVar44 = 0;
        if (local_3d0 != (byte *)0x0) {
          MVar44 = (int)local_3d0 - (int)local_508._128_8_;
        }
        pGVar17->mcloop = MVar44;
        pbVar33 = local_3e0;
        if (local_408 == 0) {
          uVar13 = pGVar17->link;
          uVar5 = local_3f8->spadjust;
          if (uVar5 == 0) {
            pbVar33 = local_3e0 + -7;
          }
          else {
            if ((uint)uVar5 == (int)(char)(byte)uVar5) {
              local_3e0[-9] = (byte)uVar5;
              bVar50 = 0x83;
              pbVar33 = local_3e0 + -3;
            }
            else {
              *(uint *)(local_3e0 + -9) = (uint)uVar5;
              bVar50 = 0x81;
            }
            local_3e0[-0xc] = 0x48;
            local_3e0[-0xb] = bVar50;
            local_3e0[-10] = 0xc4;
          }
          if ((ulong)uVar13 == 0) {
            iVar37 = 0x10d62f;
          }
          else {
            iVar37 = (int)*(undefined8 *)
                           ((*(GCRef **)(local_508._152_8_ + 0x180))[uVar13].gcptr64 + 0x58);
          }
          *(int *)(pbVar33 + -4) = iVar37 - (int)pbVar33;
          pbVar33[-5] = 0xe9;
          if (pbVar33 <= local_3e0 + -1) {
            pbVar31 = local_3e0 + -2;
            if (pbVar33 + -1 < local_3e0 + -2) {
              pbVar31 = pbVar33 + -1;
            }
            pcStack_530 = (code *)0x141f2f;
            memset(pbVar31 + 1,0x90,(size_t)(local_3e0 + ~(ulong)pbVar31));
          }
        }
        local_3e0 = pbVar33;
        pGVar17->szmcode = (int)local_3e0 - (int)local_508._128_8_;
        pSVar6 = local_3f8->snap;
        uVar38 = local_3f8->nsnap - 1;
        if (uVar38 != 0) {
          uVar29 = (ulong)uVar38;
          puVar45 = &pSVar6[uVar29].mcofs;
          do {
            uVar29 = uVar29 - 1;
            *puVar45 = ((short)local_3d8 - (short)local_508._128_8_) -
                       pSVar6[uVar29 & 0xffffffff].mcofs;
            puVar45 = puVar45 + -6;
          } while ((int)uVar29 != 0);
        }
        pSVar6->mcofs = 0;
        pcStack_530 = (code *)0x141faa;
        lj_mcode_sync(pGVar17->mcode,local_3d8);
        return;
      }
      pcStack_530 = asm_snap_prev;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_BADRA);
    }
    pcStack_530 = (code *)0x141dbc;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_530 = (code *)0x141dd1;
    pGVar17 = lj_trace_alloc(J->L,pGVar17);
    J->curfinal = pGVar17;
    local_3b8 = (byte *)0x0;
    auVar59 = pmovsxbw(auVar59,0xff00ff00ff00ff00);
    goto LAB_0013ccb3;
  }
  pIVar34 = local_3f0->ir;
  if ((local_42c != 0) && (local_3f0->topslot < (BCReg)local_404)) {
    pcStack_530 = (code *)0x1414df;
    asm_snap_alloc((ASMState *)local_508,0);
  }
  bVar50 = *(byte *)(local_508._144_8_ + 0x40006);
  uVar38 = 0xffffbfef;
  if (-1 < (char)bVar50) {
    uVar55 = (uint)bVar50;
    uVar42 = local_508._168_4_ | 1 << (uVar55 & 0x1f);
    RVar53 = RStack_45c;
    local_508._168_4_ = uVar42;
    if (((RVar53 >> (uVar55 & 0x1f) & 1) != 0) ||
       ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
      *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
    }
    bVar54 = *(byte *)((long)pIVar34 + 0x40006);
    if (bVar54 != bVar50) {
      if (((char)bVar54 < '\0') || ((uVar42 >> (bVar54 & 0x1f) & 1) == 0)) {
        pcStack_530 = (code *)0x1416ed;
        emit_rma((ASMState *)local_508,XO_MOV,uVar55 | 0x80200,
                 ((jit_State *)(local_508._152_8_ + -0xc48))->penalty + 0x3c);
        goto LAB_001416ed;
      }
      *(byte *)(local_508._128_8_ + -1) = bVar54 & 7 | bVar50 * '\b' | 0xc0;
      *(byte *)(local_508._128_8_ + -2) = 0x8b;
      *(byte *)(local_508._128_8_ + -3) = bVar54 >> 3 & 1 | bVar50 >> 1 & 4 | 0x48;
      local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
      bVar50 = bVar54;
    }
    uVar38 = 1 << (bVar50 & 0x1f) ^ 0xffffbfef;
  }
LAB_001416ed:
  uVar29 = (ulong)local_43c;
  local_510 = pIVar34;
  if (uVar29 < 0x8001) {
    iVar37 = 0;
    bVar57 = true;
    local_51c = 0;
  }
  else {
    puVar24 = auStack_10372 + uVar29;
    lVar23 = uVar29 << 3;
    local_51c = 0;
    local_178 = (IRIns *)((ulong)local_178 & 0xffffffff00000000);
    local_518 = local_518 & 0xffffffff00000000;
    do {
      uVar9 = local_508._144_8_;
      IVar30 = local_528;
      uVar52 = ZEXT24(*puVar24);
      bVar50 = *(byte *)(local_508._144_8_ + lVar23 + 6);
      uVar55 = (uint)bVar50;
      if ((char)bVar50 < '\0') {
        if (*(char *)(local_508._144_8_ + lVar23 + 7) != '\0') {
          pbVar33 = (byte *)(local_508._144_8_ + lVar23 + 4);
          *pbVar33 = *pbVar33 | 0x20;
          local_178 = (IRIns *)CONCAT44(local_178._4_4_,1);
        }
      }
      else {
        uVar38 = uVar38 & ~(1 << (bVar50 & 0x1f));
        bVar54 = *(byte *)(local_508._144_8_ + lVar23 + 7);
        if (bVar54 != 0) {
          local_528.field_0.op2 = 0;
          local_528.field_0.op1 = *puVar24;
          local_528._4_4_ = IVar30._4_4_;
          pIVar34 = (IRIns *)(local_508._144_8_ + lVar23);
          pcStack_530 = (code *)0x141783;
          emit_storeofs((ASMState *)local_508,pIVar34,(uint)bVar50,4,(uint)bVar54 << 2);
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
          bVar50 = (pIVar34->field_1).r;
          uVar55 = (uint)bVar50;
          uVar52 = local_528._0_4_;
        }
      }
      if (uVar55 == uVar52) {
        local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar52 & 0x1f);
      }
      else if ((uint)uVar52 < 0x100) {
        if ((-1 < (char)bVar50) || (*(char *)(uVar9 + lVar23 + 7) != '\0')) {
          *(short *)((long)&local_138 + (ulong)(uint)uVar52 * 2) = (short)uVar29;
          local_51c = local_51c | 1 << (uVar52 & 0x1f);
        }
      }
      else {
        uVar52 = (int)local_518;
        if (-1 < (char)bVar50) {
          uVar52 = 1;
        }
        local_518 = CONCAT44(local_518._4_4_,uVar52);
      }
      uVar55 = (int)uVar29 - 1;
      uVar29 = (ulong)uVar55;
      puVar24 = puVar24 + -1;
      lVar23 = lVar23 + -8;
    } while (0x8000 < uVar55);
    bVar57 = (int)local_178 == 0;
    iVar37 = (int)local_518;
  }
  uVar55 = local_448 * 4 + 4 & 0xfffffff0;
  if ((int)local_448 < 3) {
    uVar55 = 0;
  }
  uVar42 = uVar55 - local_3f0->spadjust;
  uVar29 = 0;
  if (0 < (int)uVar42) {
    uVar29 = (ulong)uVar42;
  }
  if ((int)uVar42 < 0) {
    uVar55 = (uint)local_3f0->spadjust;
  }
  local_3f8->spadjust = (uint16_t)uVar55;
  if ((!bVar57) && (uVar36 = (ulong)local_43c, 0x8000 < uVar36)) {
    local_16c = uVar42;
    local_158 = uVar29;
    local_518 = CONCAT44(local_518._4_4_,iVar37);
    puVar24 = auStack_10372 + uVar36;
    lVar23 = uVar36 << 3;
    do {
      uVar9 = local_508._144_8_;
      bVar50 = *(byte *)(local_508._144_8_ + lVar23 + 4);
      if ((bVar50 & 0x20) != 0) {
        *(byte *)(local_508._144_8_ + lVar23 + 4) = bVar50 & 0xdf;
        uVar13 = *puVar24;
        if (uVar13 < 0x100) {
          *(byte *)(local_508._144_8_ + lVar23 + 6) = (byte)uVar13 | 0x80;
        }
        else if ((int)local_158 + (uint)(uVar13 >> 8) * 4 ==
                 (uint)*(byte *)(local_508._144_8_ + lVar23 + 7) << 2) goto LAB_001419fc;
        uVar55 = 0xffff0000;
        if (1 < (byte)((bVar50 & 0x1f) - 0xd)) {
          uVar55 = 0xbfef;
        }
        local_528.field_1.op12 = uVar38;
        if ((uVar55 & uVar38) == 0) goto LAB_00141fc9;
        local_178 = (IRIns *)(local_508._144_8_ + lVar23);
        pcStack_530 = (code *)0x141975;
        RVar21 = ra_allocref((ASMState *)local_508,(IRRef)uVar36,uVar55 & uVar38);
        pcStack_530 = (code *)0x14199b;
        emit_storeofs((ASMState *)local_508,local_178,RVar21,4,
                      (uint)*(byte *)(uVar9 + lVar23 + 7) << 2);
        bVar50 = (byte)RVar21 & 0x1f;
        if (RVar21 == uVar13) {
          local_508._168_4_ = local_508._168_4_ | 1 << ((byte)RVar21 & 0x1f);
          uVar55 = local_51c & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
        }
        else {
          uVar52 = (int)local_518;
          if (0xff < uVar13) {
            uVar52 = 1;
          }
          local_518 = CONCAT44(local_518._4_4_,uVar52);
          uVar55 = local_51c;
        }
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
        uVar38 = local_528._0_4_ & ~(1 << (RVar21 & 0x1f));
        local_51c = uVar55;
      }
LAB_001419fc:
      uVar55 = (IRRef)uVar36 - 1;
      uVar36 = (ulong)uVar55;
      puVar24 = puVar24 + -1;
      lVar23 = lVar23 + -8;
    } while (0x8000 < uVar55);
    uVar29 = local_158;
    iVar37 = (int)local_518;
    uVar42 = local_16c;
  }
  pIVar34 = local_510;
  *(uint *)(local_508._128_8_ + -4) = (uint)local_3f8->traceno;
  local_508._128_8_ = local_508._128_8_ + -4;
  pcStack_530 = (code *)0x141a7c;
  emit_rma((ASMState *)local_508,XO_MOVmi,0,
           ((jit_State *)(local_508._152_8_ + -0xc48))->penalty + 0x30);
  if (0 < (int)uVar42) {
    if (uVar42 < 0x81) {
      *(byte *)(local_508._128_8_ + -1) = (byte)-(int)uVar29;
      local_508._128_8_ = local_508._128_8_ + -1;
      uVar52 = 0x830000fe;
    }
    else {
      *(int *)(local_508._128_8_ + -4) = -(int)uVar29;
      local_508._128_8_ = local_508._128_8_ + -4;
      uVar52 = 0x810000fe;
    }
    *(byte *)(local_508._128_8_ + -1) = 0xc4;
    *(undefined4 *)(local_508._128_8_ + -5) = uVar52;
    *(byte *)(local_508._128_8_ + -3) = 0x48;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
  }
  if (iVar37 != 0) {
    if ((local_508._168_4_ & 0xffffbfef) != 0xffffbfef) {
      uVar55 = local_508._168_4_ & 0xffffbfef ^ 0xffffbfef;
      do {
        uVar42 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        if (0xff < local_370[*(ushort *)(local_508 + (ulong)uVar42 * 4) - 0x8001]) {
          local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar42 & 0x1f);
          pcStack_530 = (code *)0x141b39;
          emit_loadofs((ASMState *)local_508,
                       (IRIns *)(local_508._144_8_ +
                                (ulong)*(ushort *)(local_508 + (ulong)uVar42 * 4) * 8),uVar42,4,
                       local_370[*(ushort *)(local_508 + (ulong)uVar42 * 4) - 0x8001] >> 6 &
                       0xfffffffc);
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
        }
        uVar55 = uVar55 & ~(1 << (uVar42 & 0x1f));
      } while (uVar55 != 0);
    }
  }
  local_510 = pIVar34 + 0x8000;
  uVar55 = local_51c;
  do {
    uVar42 = uVar55 & 0xbfef;
    local_528.field_1.op12 = uVar38;
    local_51c = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> local_51c & 1) == 0; local_51c = local_51c + 1) {
      }
    }
    uVar51 = uVar55 & 0xffff0000;
    RVar21 = 0;
    if (uVar51 != 0) {
      for (; (uVar51 >> RVar21 & 1) == 0; RVar21 = RVar21 + 1) {
      }
    }
    while( true ) {
      uVar22 = local_508._168_4_ & uVar55;
      if (uVar22 != 0) break;
      if (uVar55 == 0) {
        bVar50 = local_3f0->topslot;
        local_3f8->topslot = bVar50;
        if (bVar50 < (BCReg)local_404) {
          exitno = *(ExitNo *)(local_508._152_8_ + 0xbcc);
          local_3f8->topslot = (uint8_t)local_404;
          pcStack_530 = (code *)0x141cb7;
          asm_stack_check((ASMState *)local_508,(BCReg)local_404,local_510,local_528._0_4_ & 0xbfef,
                          exitno);
        }
        goto LAB_00141cee;
      }
      if (uVar42 != 0) {
        uVar22 = local_508._168_4_ & (uVar42 ^ 0xbfef) & uVar38;
        if (uVar22 == 0) goto LAB_00141fc9;
        RVar15 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> RVar15 & 1) == 0; RVar15 = RVar15 + 1) {
          }
        }
        pcStack_530 = (code *)0x141bcd;
        ra_rename((ASMState *)local_508,local_51c,RVar15);
      }
      if (uVar51 != 0) {
        uVar22 = local_508._168_4_ & (uVar51 ^ 0xffff0000) & local_528._0_4_;
        if (uVar22 == 0) goto LAB_00141fc9;
        RVar15 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> RVar15 & 1) == 0; RVar15 = RVar15 + 1) {
          }
        }
        pcStack_530 = (code *)0x141bf7;
        ra_rename((ASMState *)local_508,RVar21,RVar15);
      }
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_00141ded;
    }
    uVar42 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
      }
    }
    pIVar34 = (IRIns *)(local_508._144_8_ +
                       (ulong)*(ushort *)((long)&local_138 + (ulong)uVar42 * 2) * 8);
    uVar55 = uVar55 & ~(1 << (uVar42 & 0x1f));
    uVar38 = local_528._0_4_ & ~(1 << (uVar42 & 0x1f));
    local_508._168_4_ = local_508._168_4_ | 1 << ((pIVar34->field_1).r & 0x1f);
    pcStack_530 = (code *)0x141c4f;
    emit_movrr((ASMState *)local_508,pIVar34,(uint)(pIVar34->field_1).r,uVar42);
  } while ((ulong)local_508._136_8_ <= (ulong)local_508._128_8_);
  goto LAB_00141ded;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}